

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void custom_compare_commit_compact(bool eqkeys)

{
  char *__s;
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_kvs_handle **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  hbtrie *phVar6;
  hbtrie *phVar7;
  fdb_file_handle **ppfVar8;
  btree *pbVar9;
  size_t sVar10;
  fdb_doc *pfVar11;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_handle **ppfVar13;
  fdb_kvs_handle *pfVar14;
  size_t sVar15;
  char cVar16;
  fdb_kvs_handle *pfVar17;
  btree_kv_ops *doc_00;
  fdb_config *pfVar18;
  fdb_doc **ppfVar19;
  fdb_doc *pfVar20;
  char *unaff_RBP;
  char *pcVar21;
  fdb_encryption_key *pfVar22;
  undefined7 in_register_00000039;
  undefined1 *puVar23;
  char *pcVar24;
  long lVar25;
  code *handle;
  uint uVar26;
  char *pcVar27;
  ulong uVar28;
  fdb_doc **doc_01;
  btree_kv_ops *ptr_fhandle;
  btree_kv_ops *__s2;
  fdb_kvs_handle **ppfVar29;
  bool bVar30;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  uint64_t user_param;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char keybuf [1024];
  fdb_kvs_handle *pfStack_1e5e0;
  fdb_file_handle *pfStack_1e5d8;
  void *pvStack_1e5d0;
  size_t asStack_1e5c8 [3];
  undefined4 uStack_1e5b0;
  undefined4 uStack_1e5ac;
  undefined4 uStack_1e5a8;
  undefined4 uStack_1e5a4;
  undefined4 uStack_1e5a0;
  fdb_kvs_config fStack_1e598;
  timeval tStack_1e580;
  fdb_config fStack_1e570;
  char acStack_1e478 [256];
  char acStack_1e378 [256];
  char acStack_1e278 [264];
  fdb_config *pfStack_1e170;
  fdb_kvs_handle **ppfStack_1e168;
  fdb_kvs_handle *pfStack_1e160;
  fdb_kvs_handle **ppfStack_1e158;
  fdb_kvs_handle *pfStack_1e150;
  code *pcStack_1e148;
  fdb_kvs_handle *pfStack_1e130;
  fdb_file_handle *pfStack_1e128;
  fdb_kvs_handle *pfStack_1e120;
  fdb_kvs_handle *pfStack_1e118;
  fdb_kvs_config fStack_1e110;
  timeval tStack_1e0f8;
  fdb_config fStack_1e0e8;
  fdb_kvs_handle *apfStack_1dff0 [32];
  fdb_config fStack_1def0;
  fdb_kvs_handle **ppfStack_1dde8;
  fdb_kvs_handle **ppfStack_1dde0;
  fdb_kvs_handle **ppfStack_1ddd8;
  fdb_kvs_handle *pfStack_1ddd0;
  fdb_kvs_handle *pfStack_1ddc0;
  fdb_kvs_handle *pfStack_1ddb8;
  fdb_kvs_handle **ppfStack_1ddb0;
  fdb_kvs_handle *pfStack_1dda8;
  fdb_kvs_config fStack_1dda0;
  undefined1 auStack_1dd88 [128];
  fdb_kvs_handle *apfStack_1dd08 [33];
  fdb_config fStack_1dc00;
  fdb_kvs_handle *apfStack_1db08 [32];
  fdb_kvs_handle *apfStack_1da08 [32];
  fdb_kvs_handle fStack_1d908;
  undefined8 auStack_1d508 [896];
  fdb_kvs_handle *apfStack_1b908 [1025];
  fdb_doc **ppfStack_19900;
  char *pcStack_198f8;
  long lStack_198f0;
  fdb_doc *pfStack_198e8;
  fdb_doc **ppfStack_198e0;
  fdb_doc *pfStack_198d8;
  fdb_doc *pfStack_198c0;
  fdb_file_handle *pfStack_198b8;
  long lStack_198b0;
  fdb_kvs_handle *pfStack_198a8;
  long lStack_198a0;
  long lStack_19898;
  fdb_doc **ppfStack_19890;
  long lStack_19888;
  fdb_doc **ppfStack_19880;
  size_t sStack_19878;
  timeval tStack_19870;
  fdb_kvs_config fStack_19860;
  fdb_file_info fStack_19848;
  fdb_doc afStack_19800 [3];
  char acStack_19700 [264];
  fdb_config fStack_195f8;
  char acStack_19500 [256];
  fdb_doc *apfStack_19400 [2999];
  size_t sStack_13648;
  size_t asStack_13640 [1023];
  undefined1 auStack_11641 [57225];
  fdb_doc **ppfStack_36b8;
  fdb_config *pfStack_36b0;
  fdb_file_handle **ppfStack_36a8;
  ulong uStack_36a0;
  fdb_kvs_handle **ppfStack_3698;
  fdb_kvs_handle **ppfStack_3690;
  fdb_doc *pfStack_3678;
  fdb_kvs_handle *pfStack_3670;
  undefined1 auStack_3668 [24];
  fdb_file_handle *pfStack_3650;
  fdb_kvs_handle *pfStack_3648;
  fdb_kvs_config fStack_3640;
  fdb_doc *apfStack_3628 [31];
  timeval tStack_3530;
  fdb_config fStack_3520;
  char acStack_3428 [256];
  fdb_file_handle *apfStack_3328 [32];
  char acStack_3228 [264];
  fdb_kvs_handle **ppfStack_3120;
  char *pcStack_3118;
  char *pcStack_3110;
  ulong uStack_3108;
  undefined8 uStack_3100;
  code *pcStack_30f8;
  fdb_file_handle *pfStack_30f0;
  fdb_kvs_handle *pfStack_30e8;
  char acStack_30e0 [32];
  fdb_kvs_config fStack_30c0;
  timeval tStack_30a8;
  fdb_file_info afStack_3098 [3];
  fdb_config fStack_2fa0;
  fdb_config *pfStack_2ea8;
  fdb_kvs_handle **ppfStack_2ea0;
  fdb_kvs_handle *pfStack_2e98;
  fdb_doc *pfStack_2e90;
  fdb_kvs_handle *pfStack_2e88;
  fdb_encryption_key *pfStack_2e80;
  fdb_kvs_handle *pfStack_2e70;
  fdb_file_handle *pfStack_2e68;
  undefined1 auStack_2e60 [8];
  undefined1 auStack_2e58 [48];
  fdb_kvs_handle *apfStack_2e28 [32];
  fdb_doc afStack_2d28 [3];
  fdb_config fStack_2c28;
  ulong uStack_2b30;
  fdb_kvs_handle **ppfStack_2b28;
  fdb_kvs_handle *pfStack_2b20;
  fdb_doc *pfStack_2b18;
  fdb_kvs_handle *pfStack_2b10;
  fdb_encryption_key *pfStack_2b08;
  fdb_doc *pfStack_2af8;
  fdb_kvs_handle *pfStack_2af0;
  fdb_kvs_handle *pfStack_2ae8;
  fdb_file_handle *pfStack_2ae0;
  fdb_file_handle *pfStack_2ad8;
  fdb_doc *apfStack_2ad0 [11];
  fdb_kvs_config fStack_2a78;
  timeval tStack_2a60;
  fdb_kvs_handle fStack_2a50;
  fdb_config fStack_2750;
  fdb_kvs_config *pfStack_2658;
  fdb_file_handle **ppfStack_2650;
  fdb_file_handle **ppfStack_2648;
  fdb_kvs_handle **ppfStack_2640;
  char *pcStack_2638;
  fdb_doc *pfStack_2630;
  fdb_file_handle *pfStack_2618;
  fdb_file_handle *pfStack_2610;
  fdb_kvs_handle *pfStack_2608;
  fdb_kvs_handle *pfStack_2600;
  timeval tStack_25f8;
  fdb_doc *apfStack_25e8 [31];
  fdb_kvs_config fStack_24f0;
  char acStack_24d8 [264];
  fdb_config fStack_23d0;
  char acStack_22d8 [256];
  char acStack_21d8 [264];
  fdb_kvs_handle *pfStack_20d0;
  fdb_kvs_handle *pfStack_20c8;
  fdb_kvs_handle *pfStack_20c0;
  fdb_kvs_handle *pfStack_20b8;
  fdb_kvs_handle **ppfStack_20b0;
  fdb_doc *pfStack_20a8;
  fdb_kvs_handle *pfStack_2098;
  fdb_kvs_handle *pfStack_2090;
  undefined1 auStack_2088 [32];
  undefined1 auStack_2068 [280];
  fdb_doc afStack_1f50 [3];
  fdb_config afStack_1e48 [2];
  fdb_kvs_handle *pfStack_1c48;
  fdb_kvs_handle *pfStack_1c40;
  fdb_kvs_handle *pfStack_1c38;
  fdb_doc *pfStack_1c30;
  btree *pbStack_1c28;
  fdb_doc *pfStack_1c20;
  fdb_doc *pfStack_1c10;
  fdb_kvs_handle *pfStack_1c08;
  fdb_file_handle *pfStack_1c00;
  undefined1 auStack_1bf8 [88];
  timeval tStack_1ba0;
  fdb_doc afStack_1b90 [3];
  fdb_doc afStack_1a78 [3];
  char acStack_1978 [256];
  fdb_config fStack_1878;
  btree_kv_ops *pbStack_1780;
  fdb_kvs_handle *pfStack_1778;
  fdb_kvs_handle *pfStack_1770;
  btree *pbStack_1768;
  fdb_doc *pfStack_1760;
  fdb_doc *pfStack_1758;
  undefined1 auStack_1748 [16];
  undefined1 auStack_1738 [16];
  timeval tStack_1728;
  undefined1 auStack_1718 [280];
  fdb_doc afStack_1600 [5];
  size_t *psStack_1470;
  btree abStack_12e0 [4];
  char acStack_11e0 [256];
  fdb_config fStack_10e0;
  fdb_kvs_handle **ppfStack_fe8;
  fdb_kvs_handle *pfStack_fe0;
  fdb_kvs_handle *pfStack_fd8;
  btree *pbStack_fd0;
  fdb_file_handle **ppfStack_fc8;
  fdb_doc *pfStack_fc0;
  fdb_kvs_handle *pfStack_fb0;
  undefined1 auStack_fa8 [56];
  size_t *psStack_f70;
  undefined1 auStack_f40 [40];
  undefined8 uStack_f18;
  void *pvStack_f10;
  undefined8 uStack_f08;
  undefined8 uStack_f00;
  ulong uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined1 uStack_ed8;
  undefined1 auStack_e18 [520];
  fdb_config fStack_c10;
  char acStack_b18 [264];
  fdb_kvs_handle *pfStack_a10;
  fdb_kvs_handle *pfStack_a08;
  fdb_kvs_handle *pfStack_a00;
  fdb_kvs_handle *pfStack_9f8;
  fdb_kvs_handle *pfStack_9f0;
  fdb_doc *pfStack_9e8;
  fdb_doc *pfStack_9c8;
  fdb_file_handle *pfStack_9c0;
  int iStack_9b4;
  undefined1 auStack_9b0 [56];
  undefined1 auStack_978 [40];
  undefined1 auStack_950 [80];
  undefined1 auStack_900 [512];
  fdb_doc fStack_700;
  fdb_custom_cmp_variable p_Stack_6a8;
  void *pvStack_6a0;
  undefined1 uStack_690;
  undefined4 uStack_68c;
  undefined1 uStack_681;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_670 [23];
  ulong uStack_5b8;
  fdb_kvs_handle *pfStack_5b0;
  fdb_kvs_handle *pfStack_5a8;
  fdb_kvs_handle *pfStack_5a0;
  fdb_kvs_handle *pfStack_598;
  code *pcStack_590;
  fdb_kvs_handle *local_580;
  fdb_kvs_handle *local_578;
  fdb_doc *local_570;
  fdb_kvs_handle *local_568;
  kvs_ops_stat *local_560;
  undefined1 local_558 [40];
  undefined1 local_530 [249];
  undefined1 local_437 [3];
  undefined1 local_434 [1019];
  undefined1 local_39;
  
  uVar28 = CONCAT71(in_register_00000039,eqkeys) & 0xffffffff;
  handle = (code *)0x0;
  pcStack_590 = (code *)0x1157a1;
  gettimeofday((timeval *)(local_558 + 0x18),(__timezone_ptr_t)0x0);
  pcStack_590 = (code *)0x1157a6;
  memleak_start();
  local_570 = (fdb_doc *)0x0;
  pcVar27 = local_530;
  pcStack_590 = (code *)0x1157b8;
  fdb_get_default_config();
  pfVar12 = (fdb_kvs_handle *)local_558;
  pcStack_590 = (code *)0x1157c5;
  fdb_get_default_kvs_config();
  pcVar24 = "rm -rf  dummy* > errorlog.txt";
  pcStack_590 = (code *)0x1157d4;
  system("rm -rf  dummy* > errorlog.txt");
  local_530._8_8_ = (filemgr *)0x0;
  local_530._16_8_ = 0x400;
  local_530._36_4_ = 1;
  local_530[0x2f] = 0;
  local_530[0x40] = 1;
  local_558._16_8_ = &local_560;
  local_560 = (kvs_ops_stat *)0x1234;
  local_558._8_8_ = _cmp_variable;
  pcStack_590 = (code *)0x115815;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar14 = (fdb_kvs_handle *)&local_580;
  pcStack_590 = (code *)0x115829;
  fVar3 = fdb_open((fdb_file_handle **)pfVar14,"./dummy1",(fdb_config *)pcVar27);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001159ed;
  pcStack_590 = (code *)0x115845;
  pfVar14 = local_580;
  fVar3 = fdb_kvs_open_default((fdb_file_handle *)local_580,&local_568,(fdb_kvs_config *)local_558);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001159f2;
  pcVar24 = "%d";
  handle = (code *)(local_530 + 0xf8);
  unaff_RBP = "000%d";
  pcVar27 = (char *)0x0;
  do {
    cVar16 = (char)uVar28;
    if (cVar16 == '\0') {
      pcStack_590 = (code *)0x115896;
      sprintf((char *)handle,"000%d",pcVar27);
      sVar15 = 0x3fc;
      puVar23 = local_434;
    }
    else {
      pcStack_590 = (code *)0x11587a;
      sprintf((char *)handle,"%d",pcVar27);
      sVar15 = 0x3ff;
      puVar23 = local_437;
    }
    pcStack_590 = (code *)0x1158ad;
    memset(puVar23,0x61,sVar15);
    pfVar12 = local_568;
    local_39 = 0;
    pcStack_590 = (code *)0x1158c2;
    sVar15 = strlen((char *)handle);
    pcStack_590 = (code *)0x1158d5;
    pfVar14 = pfVar12;
    fVar3 = fdb_set_kv(pfVar12,handle,sVar15,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_590 = (code *)0x1159e8;
      custom_compare_commit_compact();
      goto LAB_001159e8;
    }
    uVar26 = (int)pcVar27 + 1;
    pcVar27 = (char *)(ulong)uVar26;
  } while (uVar26 != 10);
  pcStack_590 = (code *)0x1158f2;
  fdb_compact((fdb_file_handle *)local_580,(char *)0x0);
  pcStack_590 = (code *)0x115901;
  fdb_commit((fdb_file_handle *)local_580,'\x01');
  pcStack_590 = (code *)0x11590d;
  fdb_compact((fdb_file_handle *)local_580,(char *)0x0);
  pcStack_590 = (code *)0x11592d;
  fdb_iterator_init(local_568,(fdb_iterator **)&local_578,(void *)0x0,0,(void *)0x0,0,0);
  unaff_RBP = (char *)0xffffffff;
  pcVar27 = (char *)&local_570;
  do {
    pcStack_590 = (code *)0x115944;
    pfVar14 = local_578;
    fVar3 = fdb_iterator_get((fdb_iterator *)local_578,(fdb_doc **)pcVar27);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001159e8;
    pcStack_590 = (code *)0x115956;
    fdb_doc_free(local_570);
    local_570 = (fdb_doc *)0x0;
    pcStack_590 = (code *)0x115969;
    pfVar14 = local_578;
    fVar3 = fdb_iterator_next((fdb_iterator *)local_578);
    uVar26 = (int)unaff_RBP + 1;
    unaff_RBP = (char *)(ulong)uVar26;
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  if (cVar16 != '\0') {
    if (uVar26 == 0) goto LAB_00115982;
    pcStack_590 = (code *)0x11597d;
    custom_compare_commit_compact();
  }
  if (uVar26 == 9) {
LAB_00115982:
    pcStack_590 = (code *)0x11598c;
    fdb_iterator_close((fdb_iterator *)local_578);
    pcStack_590 = (code *)0x115996;
    fdb_close((fdb_file_handle *)local_580);
    pcStack_590 = (code *)0x11599b;
    fdb_shutdown();
    pcStack_590 = (code *)0x1159a0;
    memleak_end();
    pcVar24 = "%s PASSED\n";
    if (custom_compare_commit_compact(bool)::__test_pass != '\0') {
      pcVar24 = "%s FAILED\n";
    }
    pcStack_590 = (code *)0x1159d1;
    fprintf(_stderr,pcVar24,"custom compare commit compact");
    return;
  }
  goto LAB_001159f7;
LAB_00115f1e:
  pfStack_9e8 = (fdb_doc *)0x115f23;
  custom_seqnum_test();
  pfVar11 = (fdb_doc *)pcVar21;
LAB_00115f23:
  pcVar21 = (char *)pfVar11;
  pfStack_9e8 = (fdb_doc *)0x115f28;
  custom_seqnum_test();
LAB_00115f28:
  pfStack_9e8 = (fdb_doc *)0x115f33;
  custom_seqnum_test();
LAB_00115f33:
  pfStack_9e8 = (fdb_doc *)0x115f3e;
  custom_seqnum_test();
LAB_00115f3e:
  pfStack_9e8 = (fdb_doc *)0x115f43;
  custom_seqnum_test();
LAB_00115f43:
  pfStack_9e8 = (fdb_doc *)0x115f48;
  custom_seqnum_test();
LAB_00115f48:
  pfStack_9e8 = (fdb_doc *)0x115f4d;
  custom_seqnum_test();
  goto LAB_00115f4d;
LAB_00116498:
  pfStack_fc0 = (fdb_doc *)0x1164a3;
  doc_compression_test();
  handle = (code *)pfVar12;
LAB_001164a3:
  pfVar12 = (fdb_kvs_handle *)handle;
  pfStack_fc0 = (fdb_doc *)0x1164a8;
  doc_compression_test();
LAB_001164a8:
  pfStack_fc0 = (fdb_doc *)0x1164b3;
  doc_compression_test();
  handle = (code *)pfVar12;
LAB_001164b3:
  ppfVar13 = &pfStack_fb0;
  pfStack_fc0 = (fdb_doc *)0x1164b8;
  doc_compression_test();
  goto LAB_001164b8;
LAB_00116f9c:
  pfStack_1c20 = (fdb_doc *)0x116fa1;
  purge_logically_deleted_doc_test();
  pfVar20 = (fdb_doc *)pcVar21;
LAB_00116fa1:
  pfStack_1c20 = (fdb_doc *)0x116fa6;
  purge_logically_deleted_doc_test();
LAB_00116fa6:
  pfStack_1c20 = (fdb_doc *)0x116fab;
  purge_logically_deleted_doc_test();
LAB_00116fab:
  pfStack_1c20 = (fdb_doc *)0x116fb6;
  purge_logically_deleted_doc_test();
LAB_00116fb6:
  pfStack_1c20 = (fdb_doc *)0x116fbb;
  purge_logically_deleted_doc_test();
LAB_00116fbb:
  pfStack_1c20 = (fdb_doc *)0x116fc6;
  purge_logically_deleted_doc_test();
  pfVar12 = pfVar14;
  pcVar21 = (char *)pfVar20;
LAB_00116fc6:
  pfStack_1c20 = (fdb_doc *)0x116fcb;
  purge_logically_deleted_doc_test();
  goto LAB_00116fcb;
LAB_001172d0:
  pfStack_20a8 = (fdb_doc *)0x1172e0;
  api_wrapper_test();
LAB_001172e0:
  pfStack_20a8 = (fdb_doc *)0x1172e5;
  api_wrapper_test();
LAB_001172e5:
  pfVar14 = (fdb_kvs_handle *)(auStack_2068 + 0x18);
  pfStack_20a8 = (fdb_doc *)0x1172ea;
  api_wrapper_test();
  goto LAB_001172ea;
LAB_00117e03:
  pfStack_2b08 = (fdb_encryption_key *)0x117e13;
  flush_before_commit_multi_writers_test();
  pfVar20 = pfVar11;
  goto LAB_00117e13;
LAB_00118159:
  pfStack_2e80 = (fdb_encryption_key *)0x118166;
  auto_commit_test();
  pfVar14 = (fdb_kvs_handle *)pcVar24;
LAB_00118166:
  pcVar24 = (char *)pfVar14;
  pfStack_2e80 = (fdb_encryption_key *)0x11816b;
  auto_commit_test();
LAB_0011816b:
  pfStack_2e80 = (fdb_encryption_key *)0x118178;
  auto_commit_test();
  pfVar14 = (fdb_kvs_handle *)pcVar24;
LAB_00118178:
  pfVar11 = afStack_2d28;
  ppfVar13 = apfStack_2e28;
  pfStack_2e80 = (fdb_encryption_key *)0x11817d;
  auto_commit_test();
  goto LAB_0011817d;
LAB_0011943e:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar12 = (fdb_kvs_handle *)pcVar27;
LAB_00119452:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
LAB_001159e8:
  pcStack_590 = (code *)0x1159ed;
  custom_compare_commit_compact();
LAB_001159ed:
  pcStack_590 = (code *)0x1159f2;
  custom_compare_commit_compact();
LAB_001159f2:
  pcStack_590 = (code *)0x1159f7;
  custom_compare_commit_compact();
LAB_001159f7:
  pcStack_590 = custom_seqnum_test;
  custom_compare_commit_compact();
  pcVar21 = (char *)((ulong)pfVar14 & 0xffffffff);
  pfStack_9e8 = (fdb_doc *)0x115a1e;
  uStack_5b8 = uVar28;
  pfStack_5b0 = (fdb_kvs_handle *)pcVar24;
  pfStack_5a8 = (fdb_kvs_handle *)handle;
  pfStack_5a0 = (fdb_kvs_handle *)pcVar27;
  pfStack_598 = pfVar12;
  pcStack_590 = (code *)unaff_RBP;
  gettimeofday((timeval *)(auStack_978 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_9e8 = (fdb_doc *)0x115a23;
  memleak_start();
  pfStack_9c8 = &fStack_700;
  fStack_700.seqnum = 0;
  fStack_700.deleted = false;
  fStack_700._73_3_ = 0;
  fStack_700.flags = 0;
  fStack_700.keylen = 0;
  fStack_700.metalen = 0;
  fStack_700.bodylen = 0;
  fStack_700.size_ondisk = 0;
  fStack_700.offset = 0;
  fStack_700.meta = (void *)0x0;
  fStack_700.key = auStack_900 + 0x100;
  fStack_700.body = auStack_900;
  pfStack_9e8 = (fdb_doc *)0x115a6a;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar17 = (fdb_kvs_handle *)&stack0xfffffffffffff950;
  pfStack_9e8 = (fdb_doc *)0x115a7a;
  fdb_get_default_config();
  pfStack_9e8 = (fdb_doc *)0x115a84;
  fdb_get_default_kvs_config();
  p_Stack_6a8 = (fdb_custom_cmp_variable)0x0;
  pvStack_6a0 = (void *)0x400;
  uStack_68c = 1;
  uStack_690 = 1;
  uStack_681 = 0;
  aaStack_670[0]._0_1_ = SUB81(pcVar21,0);
  pfStack_9e8 = (fdb_doc *)0x115abb;
  fdb_open(&pfStack_9c0,"./dummy1",(fdb_config *)pfVar17);
  iStack_9b4 = (int)pfVar14;
  if (iStack_9b4 != 0) {
    pcVar27 = (char *)0x3;
    pfVar17 = (fdb_kvs_handle *)0x18;
    pfVar12 = (fdb_kvs_handle *)auStack_9b0;
    pcVar24 = auStack_978;
    handle = logCallbackFunc;
    pcVar21 = "custom_seqnum_test";
    do {
      pfStack_9e8 = (fdb_doc *)0x115afe;
      sprintf((char *)pfVar12,"kv%d",(ulong)pcVar27 & 0xffffffff);
      pfStack_9e8 = (fdb_doc *)0x115b16;
      fVar3 = fdb_kvs_open(pfStack_9c0,
                           (fdb_kvs_handle **)
                           (auStack_9b0 + 0x10 + (long)&(pfVar17->kvs_config).create_if_missing),
                           (char *)pfVar12,(fdb_kvs_config *)pcVar24);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115f48;
      pfStack_9e8 = (fdb_doc *)0x115b2e;
      fVar3 = fdb_set_log_callback
                        (*(fdb_kvs_handle **)(auStack_9b0 + (long)pcVar27 * 8 + 0x10),
                         logCallbackFunc,"custom_seqnum_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115f43;
      pfVar17 = (fdb_kvs_handle *)&pfVar17[-1].bub_ctx.handle;
      bVar30 = (fdb_kvs_handle *)pcVar27 != (fdb_kvs_handle *)0x0;
      pcVar27 = (char *)((long)&(((fdb_kvs_handle *)((long)pcVar27 + -0x208))->bub_ctx).handle + 7);
    } while (bVar30);
    pfVar14 = (fdb_kvs_handle *)0x4;
LAB_00115b88:
    pfVar12 = (fdb_kvs_handle *)(auStack_900 + 0x100);
    pcVar24 = "body%d";
    pcVar21 = (char *)0x0;
    do {
      pfStack_9e8 = (fdb_doc *)0x115bbb;
      sprintf((char *)pfVar12,"key%d",(ulong)pcVar21 & 0xffffffff);
      pfStack_9e8 = (fdb_doc *)0x115bca;
      sprintf((char *)auStack_900,"body%d",(ulong)pcVar21 & 0xffffffff);
      pfVar17 = (fdb_kvs_handle *)(auStack_950 + (long)pcVar21 * 8);
      pfStack_9e8 = (fdb_doc *)0x115bdd;
      sVar15 = strlen((char *)pfVar12);
      pfStack_9e8 = (fdb_doc *)0x115be9;
      sVar5 = strlen((char *)auStack_900);
      pfStack_9e8 = (fdb_doc *)0x115c06;
      fdb_doc_create((fdb_doc **)pfVar17,pfVar12,sVar15 + 1,(void *)0x0,0,
                     (fdb_kvs_handle *)auStack_900,sVar5 + 1);
      pcVar27 = (char *)pfVar14;
      while (0 < (long)pcVar27) {
        lVar25 = (long)pcVar27 * 8;
        pcVar27 = (char *)((long)&(((fdb_kvs_handle *)((long)pcVar27 + -0x208))->bub_ctx).handle + 7
                          );
        pfStack_9e8 = (fdb_doc *)0x115c20;
        fVar3 = fdb_set(*(fdb_kvs_handle **)(auStack_9b0 + lVar25 + 8),
                        *(fdb_doc **)&pfVar17->kvs_config);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_9e8 = (fdb_doc *)0x115f1e;
          custom_seqnum_test();
          handle = (code *)auStack_900;
          goto LAB_00115f1e;
        }
      }
      pcVar21 = (char *)((long)&((fdb_doc *)pcVar21)->keylen + 1);
    } while ((fdb_doc *)pcVar21 != (fdb_doc *)0x5);
    pcVar27 = (char *)0x5;
    pcVar21 = auStack_900;
    do {
      pcVar24 = auStack_900 + 0x100;
      pfStack_9e8 = (fdb_doc *)0x115c60;
      sprintf(pcVar24,"key%d",(ulong)pcVar27 & 0xffffffff);
      pfStack_9e8 = (fdb_doc *)0x115c74;
      sprintf(pcVar21,"body%d",(ulong)pcVar27 & 0xffffffff);
      pfVar17 = (fdb_kvs_handle *)(auStack_950 + (long)pcVar27 * 8);
      pfStack_9e8 = (fdb_doc *)0x115c87;
      sVar15 = strlen(pcVar24);
      pfStack_9e8 = (fdb_doc *)0x115c93;
      sVar5 = strlen(pcVar21);
      pfStack_9e8 = (fdb_doc *)0x115cb0;
      fdb_doc_create((fdb_doc **)pfVar17,pcVar24,sVar15 + 1,(void *)0x0,0,pcVar21,sVar5 + 1);
      pfVar12 = (fdb_kvs_handle *)((long)pcVar27 * 2 + 2);
      handle = (code *)pfVar14;
      while (0 < (long)handle) {
        pcVar24 = (char *)((long)&(((fdb_kvs_handle *)((long)handle + -0x208))->bub_ctx).handle + 7)
        ;
        pfStack_9e8 = (fdb_doc *)0x115cd1;
        fdb_doc_set_seqnum(*(fdb_doc **)&pfVar17->kvs_config,(fdb_seqnum_t)pfVar12);
        pfStack_9e8 = (fdb_doc *)0x115cde;
        fVar3 = fdb_set(*(fdb_kvs_handle **)(auStack_9b0 + (long)handle * 8 + 8),
                        *(fdb_doc **)&pfVar17->kvs_config);
        handle = (code *)pcVar24;
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115f1e;
      }
      pcVar27 = &(((fdb_kvs_handle *)pcVar27)->kvs_config).field_0x1;
    } while (pcVar27 != (undefined1 *)0xa);
    phVar6 = (hbtrie *)(ulong)((int)pfVar14 - 1);
    phVar7 = phVar6;
    do {
      auStack_9b0._48_8_ = phVar7;
      pfStack_9e8 = (fdb_doc *)0x115d28;
      fdb_iterator_init(*(fdb_kvs_handle **)(auStack_9b0 + (long)phVar7 * 8 + 0x10),
                        (fdb_iterator **)auStack_9b0,(void *)0x0,0,(void *)0x0,0,0);
      pcVar24 = (char *)0x2;
      pcVar27 = (char *)(fdb_kvs_handle *)0x0;
      pfVar11 = (fdb_doc *)pcVar21;
      do {
        pfStack_9e8 = (fdb_doc *)0x115d42;
        fVar3 = fdb_iterator_get((fdb_iterator *)auStack_9b0._0_8_,&pfStack_9c8);
        pcVar21 = (char *)pfStack_9c8;
        pfVar17 = (fdb_kvs_handle *)pcVar27;
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115f23;
        pfVar17 = (fdb_kvs_handle *)pfStack_9c8->key;
        pfVar12 = *(fdb_kvs_handle **)(auStack_950 + (long)pcVar27 * 8);
        handle = (code *)pfVar12->op_stats;
        pfStack_9e8 = (fdb_doc *)0x115d6e;
        iVar4 = bcmp(pfVar17,handle,pfStack_9c8->keylen);
        if (iVar4 != 0) goto LAB_00115f28;
        pfVar17 = (fdb_kvs_handle *)((fdb_doc *)pcVar21)->body;
        handle = (code *)(pfVar12->field_6).seqtree;
        pfStack_9e8 = (fdb_doc *)0x115d8d;
        iVar4 = bcmp(pfVar17,handle,((fdb_doc *)pcVar21)->bodylen);
        if (iVar4 != 0) goto LAB_00115f33;
        puVar23 = &(((fdb_kvs_handle *)pcVar27)->kvs_config).field_0x1;
        if (pcVar27 < (fdb_kvs_handle *)0x5) {
          if ((fdb_kvs_handle *)puVar23 != (fdb_kvs_handle *)((fdb_doc *)pcVar21)->seqnum) {
            pfStack_9e8 = (fdb_doc *)0x115db5;
            custom_seqnum_test();
          }
        }
        else if ((fdb_kvs_handle *)pcVar24 != (fdb_kvs_handle *)((fdb_doc *)pcVar21)->seqnum) {
          pfStack_9e8 = (fdb_doc *)0x115de2;
          custom_seqnum_test();
        }
        pfStack_9e8 = (fdb_doc *)0x115dc6;
        fVar3 = fdb_iterator_next((fdb_iterator *)auStack_9b0._0_8_);
        pcVar24 = &(((fdb_kvs_handle *)pcVar24)->kvs_config).field_0x2;
        pcVar27 = puVar23;
        pfVar11 = (fdb_doc *)pcVar21;
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      pfStack_9e8 = (fdb_doc *)0x115dee;
      fdb_iterator_close((fdb_iterator *)auStack_9b0._0_8_);
      pfStack_9e8 = (fdb_doc *)0x115dfd;
      fdb_commit(pfStack_9c0,'\x01');
      phVar7 = (hbtrie *)((long)&((hbtrie *)(auStack_9b0._48_8_ + -0x70))->last_map_chunk + 7);
    } while (0 < (long)auStack_9b0._48_8_);
    pfStack_9e8 = (fdb_doc *)0x115e20;
    fdb_compact(pfStack_9c0,"./dummy2");
    pfVar17 = (fdb_kvs_handle *)0x5;
    pcVar27 = "key%d";
    pfVar12 = (fdb_kvs_handle *)(auStack_900 + 0x100);
    do {
      pfStack_9e8 = (fdb_doc *)0x115e48;
      sprintf((char *)pfVar12,"key%d",(ulong)pfVar17 & 0xffffffff);
      pcVar24 = (char *)((long)pfVar17 * 2 + 2);
      handle = (code *)&phVar6->valuelen;
      do {
        pfStack_9c8->seqnum = (fdb_seqnum_t)pcVar24;
        pfStack_9e8 = (fdb_doc *)0x115e68;
        fVar3 = fdb_get_byseq(*(fdb_kvs_handle **)(auStack_9b0 + (long)handle * 8 + 8),pfStack_9c8);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115f3e;
        pfVar14 = (fdb_kvs_handle *)
                  ((long)&(((fdb_kvs_handle *)((long)handle + -0x208))->bub_ctx).handle + 7);
        bVar30 = 0 < (long)handle;
        handle = (code *)pfVar14;
      } while (pfVar14 != (fdb_kvs_handle *)0x0 && bVar30);
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
      if (pfVar17 == (fdb_kvs_handle *)0xa) {
        pfStack_9e8 = (fdb_doc *)0x115e88;
        fdb_close(pfStack_9c0);
        lVar25 = 0;
        do {
          pfStack_9e8 = (fdb_doc *)0x115e97;
          fdb_doc_free(*(fdb_doc **)(auStack_950 + lVar25 * 8));
          lVar25 = lVar25 + 1;
        } while (lVar25 != 10);
        pfStack_9e8 = (fdb_doc *)0x115ea5;
        fdb_shutdown();
        pfStack_9e8 = (fdb_doc *)0x115eaa;
        memleak_end();
        pcVar24 = "single kv instance";
        if ((char)iStack_9b4 != '\0') {
          pcVar24 = "multiple kv instances";
        }
        pfStack_9e8 = (fdb_doc *)0x115eda;
        sprintf(auStack_900,"Custom sequence number test %s",pcVar24);
        pcVar24 = "%s PASSED\n";
        if (custom_seqnum_test(bool)::__test_pass != '\0') {
          pcVar24 = "%s FAILED\n";
        }
        pfStack_9e8 = (fdb_doc *)0x115f07;
        fprintf(_stderr,pcVar24,auStack_900);
        return;
      }
    } while( true );
  }
  pfStack_9e8 = (fdb_doc *)0x115b5b;
  fVar3 = fdb_kvs_open_default
                    (pfStack_9c0,(fdb_kvs_handle **)(auStack_9b0 + 0x10),
                     (fdb_kvs_config *)auStack_978);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_9e8 = (fdb_doc *)0x115b7b;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_9b0._16_8_,logCallbackFunc,"custom_seqnum_test");
    pfVar14 = (fdb_kvs_handle *)0x1;
    if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00115b88;
  }
  else {
LAB_00115f4d:
    pfStack_9e8 = (fdb_doc *)0x115f52;
    custom_seqnum_test();
  }
  pfStack_9e8 = (fdb_doc *)doc_compression_test;
  custom_seqnum_test();
  pfStack_fc0 = (fdb_doc *)0x115f7a;
  pfStack_a10 = pfVar17;
  pfStack_a08 = (fdb_kvs_handle *)pcVar24;
  pfStack_a00 = (fdb_kvs_handle *)handle;
  pfStack_9f8 = (fdb_kvs_handle *)pcVar27;
  pfStack_9f0 = pfVar12;
  pfStack_9e8 = (fdb_doc *)pcVar21;
  gettimeofday((timeval *)(auStack_f40 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_fc0 = (fdb_doc *)0x115f7f;
  memleak_start();
  pfStack_fb0 = (fdb_kvs_handle *)0x0;
  pfStack_fc0 = (fdb_doc *)0x115f90;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_fc0 = (fdb_doc *)0x115fa0;
  fdb_get_default_config();
  pbVar9 = (btree *)auStack_f40;
  pfStack_fc0 = (fdb_doc *)0x115fad;
  fdb_get_default_kvs_config();
  fStack_c10.buffercache_size = 0;
  fStack_c10.wal_threshold = 0x400;
  fStack_c10.flags = 1;
  fStack_c10.compress_document_body = true;
  fStack_c10.compaction_threshold = '\0';
  fStack_c10.purging_interval = 1;
  ppfVar8 = (fdb_file_handle **)(auStack_fa8 + 8);
  pfStack_fc0 = (fdb_doc *)0x115fe3;
  fdb_open(ppfVar8,"./dummy1",&fStack_c10);
  ppfVar13 = (fdb_kvs_handle **)auStack_fa8;
  pfStack_fc0 = (fdb_doc *)0x115ff6;
  fdb_kvs_open_default((fdb_file_handle *)auStack_fa8._8_8_,ppfVar13,(fdb_kvs_config *)pbVar9);
  pfStack_fc0 = (fdb_doc *)0x11600c;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_fa8._0_8_,logCallbackFunc,"doc_compression_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    uStack_f08 = 0x6161616161616161;
    uStack_f00 = 0x6161616161616161;
    uStack_f18._0_2_ = 0x6161;
    uStack_f18._2_6_ = 0x616161616161;
    pvStack_f10 = (void *)0x6161616161616161;
    uStack_ef8 = uStack_ef8 & 0xffffffffffffff00;
    handle = (code *)0x0;
    uVar28 = 0;
    do {
      pfStack_fc0 = (fdb_doc *)0x116050;
      sprintf(acStack_b18,"key%d",uVar28 & 0xffffffff);
      pfStack_fc0 = (fdb_doc *)0x116069;
      sprintf(auStack_e18 + 0x100,"meta%d",uVar28 & 0xffffffff);
      pfStack_fc0 = (fdb_doc *)0x11608a;
      sprintf(auStack_e18,"body%d_%s",uVar28 & 0xffffffff,&uStack_f18);
      pcVar24 = auStack_fa8 + (long)handle + 0x10;
      pfStack_fc0 = (fdb_doc *)0x11609a;
      pcVar21 = (char *)strlen(acStack_b18);
      pfStack_fc0 = (fdb_doc *)0x1160ad;
      ppfVar8 = (fdb_file_handle **)strlen(auStack_e18 + 0x100);
      pfStack_fc0 = (fdb_doc *)0x1160bd;
      sVar15 = strlen(auStack_e18);
      pfStack_fc0 = (fdb_doc *)0x1160e2;
      fdb_doc_create((fdb_doc **)pcVar24,acStack_b18,(size_t)pcVar21,auStack_e18 + 0x100,
                     (size_t)ppfVar8,auStack_e18,sVar15);
      pfStack_fc0 = (fdb_doc *)0x1160f1;
      fdb_set((fdb_kvs_handle *)auStack_fa8._0_8_,*(fdb_doc **)(auStack_fa8 + uVar28 * 8 + 0x10));
      uVar28 = uVar28 + 1;
      handle = (code *)((long)handle + 8);
    } while (uVar28 != 10);
    ppfVar13 = &pfStack_fb0;
    pfStack_fc0 = (fdb_doc *)0x11612e;
    fdb_doc_create((fdb_doc **)ppfVar13,(void *)psStack_f70[4],*psStack_f70,(void *)psStack_f70[7],
                   psStack_f70[1],(void *)0x0,0);
    pfStack_fc0 = (fdb_doc *)0x11613b;
    fVar3 = fdb_del((fdb_kvs_handle *)auStack_fa8._0_8_,(fdb_doc *)pfStack_fb0);
    pbVar9 = (btree *)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001164bd;
    pfStack_fc0 = (fdb_doc *)0x11614d;
    fdb_doc_free((fdb_doc *)pfStack_fb0);
    pfStack_fb0 = (fdb_kvs_handle *)0x0;
    ppfVar13 = (fdb_kvs_handle **)(auStack_fa8 + 8);
    pfStack_fc0 = (fdb_doc *)0x116165;
    fdb_commit((fdb_file_handle *)auStack_fa8._8_8_,'\0');
    pbVar9 = (btree *)auStack_fa8;
    pfStack_fc0 = (fdb_doc *)0x116172;
    fdb_kvs_close((fdb_kvs_handle *)auStack_fa8._0_8_);
    pfStack_fc0 = (fdb_doc *)0x11617a;
    fdb_close((fdb_file_handle *)auStack_fa8._8_8_);
    pfStack_fc0 = (fdb_doc *)0x116191;
    fdb_open((fdb_file_handle **)ppfVar13,"./dummy1",&fStack_c10);
    pfStack_fc0 = (fdb_doc *)0x1161a1;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_fa8._8_8_,(fdb_kvs_handle **)pbVar9,
               (fdb_kvs_config *)auStack_f40);
    pfStack_fc0 = (fdb_doc *)0x1161b7;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_fa8._0_8_,logCallbackFunc,"doc_compression_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      uStack_ee8 = 0x6262626262626262;
      uStack_ee0 = 0x6262626262626262;
      uStack_ef8 = 0x6262626262626262;
      uStack_ef0 = 0x6262626262626262;
      uStack_f08 = 0x6262626262626262;
      uStack_f00 = 0x6262626262626262;
      uStack_f18._0_2_ = 0x6262;
      uStack_f18._2_6_ = 0x626262626262;
      pvStack_f10 = (void *)0x6262626262626262;
      uStack_ed8 = 0;
      ppfVar8 = (fdb_file_handle **)(auStack_e18 + 0x100);
      lVar25 = 0;
      pcVar21 = (char *)0x0;
      do {
        pfStack_fc0 = (fdb_doc *)0x116209;
        sprintf((char *)ppfVar8,"newmeta%d",(ulong)pcVar21 & 0xffffffff);
        pfStack_fc0 = (fdb_doc *)0x116224;
        sprintf((char *)auStack_e18,"newbody%d_%s",(ulong)pcVar21 & 0xffffffff,&uStack_f18);
        pfStack_fc0 = (fdb_doc *)0x116234;
        pbVar9 = (btree *)strlen((char *)ppfVar8);
        pfStack_fc0 = (fdb_doc *)0x11623f;
        sVar15 = strlen((char *)auStack_e18);
        pfStack_fc0 = (fdb_doc *)0x116253;
        fdb_doc_update((fdb_doc **)(auStack_fa8 + lVar25 + 0x10),ppfVar8,(size_t)pbVar9,
                       (fdb_kvs_handle *)auStack_e18,sVar15);
        pfStack_fc0 = (fdb_doc *)0x116262;
        fdb_set((fdb_kvs_handle *)auStack_fa8._0_8_,
                *(fdb_doc **)(auStack_fa8 + (long)pcVar21 * 8 + 0x10));
        pcVar21 = (char *)((long)&((fdb_doc *)pcVar21)->keylen + 1);
        lVar25 = lVar25 + 8;
      } while ((fdb_doc *)pcVar21 == (fdb_doc *)0x1);
      pcVar24 = (char *)0x0;
      pfStack_fc0 = (fdb_doc *)0x11627e;
      fdb_commit((fdb_file_handle *)auStack_fa8._8_8_,'\0');
      pfVar12 = (fdb_kvs_handle *)auStack_e18;
      do {
        pfStack_fc0 = (fdb_doc *)0x1162a7;
        fdb_doc_create((fdb_doc **)&pfStack_fb0,
                       (void *)(*(size_t **)(auStack_fa8 + (long)pcVar24 * 8 + 0x10))[4],
                       **(size_t **)(auStack_fa8 + (long)pcVar24 * 8 + 0x10),(void *)0x0,0,
                       (void *)0x0,0);
        pfStack_fc0 = (fdb_doc *)0x1162b6;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_fa8._0_8_,(fdb_doc *)pfStack_fb0);
        handle = (code *)pfStack_fb0;
        if ((fdb_kvs_handle *)pcVar24 != (fdb_kvs_handle *)0x5) {
          if (fVar3 == FDB_RESULT_SUCCESS) {
            pbVar9 = pfStack_fb0->staletree;
            pcVar21 = *(char **)(auStack_fa8 + (long)pcVar24 * 8 + 0x10);
            ppfVar8 = (fdb_file_handle **)((fdb_doc *)pcVar21)->meta;
            pfStack_fc0 = (fdb_doc *)0x1162ef;
            iVar4 = bcmp(pbVar9,ppfVar8,(size_t)(pfStack_fb0->kvs_config).custom_cmp);
            if (iVar4 == 0) {
              pbVar9 = (((fdb_kvs_handle *)handle)->field_6).seqtree;
              ppfVar8 = (fdb_file_handle **)((fdb_doc *)pcVar21)->body;
              pfStack_fc0 = (fdb_doc *)0x11630e;
              iVar4 = bcmp(pbVar9,ppfVar8,
                           (size_t)(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp_param);
              if (iVar4 == 0) goto LAB_00116316;
              pfStack_fc0 = (fdb_doc *)0x116483;
              doc_compression_test();
              pfVar12 = (fdb_kvs_handle *)handle;
              goto LAB_00116483;
            }
          }
          else {
LAB_00116483:
            handle = (code *)pfVar12;
            pfStack_fc0 = (fdb_doc *)0x116488;
            doc_compression_test();
          }
          pfStack_fc0 = (fdb_doc *)0x116493;
          doc_compression_test();
          pfVar12 = (fdb_kvs_handle *)handle;
LAB_00116493:
          pfStack_fc0 = (fdb_doc *)0x116498;
          doc_compression_test();
          goto LAB_00116498;
        }
        handle = (code *)pfVar12;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116493;
LAB_00116316:
        pfStack_fc0 = (fdb_doc *)0x116320;
        fdb_doc_free((fdb_doc *)pfStack_fb0);
        pfStack_fb0 = (fdb_kvs_handle *)0x0;
        pcVar24 = &(((fdb_kvs_handle *)pcVar24)->kvs_config).field_0x1;
        pfVar12 = (fdb_kvs_handle *)handle;
      } while (pcVar24 != (undefined1 *)0xa);
      pfStack_fc0 = (fdb_doc *)0x116347;
      fdb_compact((fdb_file_handle *)auStack_fa8._8_8_,"./dummy2");
      pcVar24 = (char *)0x0;
      do {
        pfStack_fc0 = (fdb_doc *)0x116373;
        fdb_doc_create((fdb_doc **)&pfStack_fb0,
                       (void *)(*(size_t **)(auStack_fa8 + (long)pcVar24 * 8 + 0x10))[4],
                       **(size_t **)(auStack_fa8 + (long)pcVar24 * 8 + 0x10),(void *)0x0,0,
                       (void *)0x0,0);
        pfStack_fc0 = (fdb_doc *)0x116382;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_fa8._0_8_,(fdb_doc *)pfStack_fb0);
        pfVar12 = pfStack_fb0;
        if ((fdb_kvs_handle *)pcVar24 == (fdb_kvs_handle *)0x5) {
          pfVar12 = (fdb_kvs_handle *)handle;
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001164b3;
        }
        else {
          if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001164a3;
          pbVar9 = pfStack_fb0->staletree;
          pcVar21 = *(char **)(auStack_fa8 + (long)pcVar24 * 8 + 0x10);
          ppfVar8 = (fdb_file_handle **)((fdb_doc *)pcVar21)->meta;
          pfStack_fc0 = (fdb_doc *)0x1163bb;
          iVar4 = bcmp(pbVar9,ppfVar8,(size_t)(pfStack_fb0->kvs_config).custom_cmp);
          if (iVar4 != 0) goto LAB_001164a8;
          pbVar9 = (pfVar12->field_6).seqtree;
          ppfVar8 = (fdb_file_handle **)((fdb_doc *)pcVar21)->body;
          pfStack_fc0 = (fdb_doc *)0x1163da;
          iVar4 = bcmp(pbVar9,ppfVar8,(size_t)(pfVar12->kvs_config).custom_cmp_param);
          if (iVar4 != 0) goto LAB_00116498;
        }
        pfStack_fc0 = (fdb_doc *)0x1163ec;
        fdb_doc_free((fdb_doc *)pfStack_fb0);
        pfStack_fb0 = (fdb_kvs_handle *)0x0;
        pcVar24 = &(((fdb_kvs_handle *)pcVar24)->kvs_config).field_0x1;
        handle = (code *)pfVar12;
        if (pcVar24 == (undefined1 *)0xa) {
          lVar25 = 0;
          do {
            pfStack_fc0 = (fdb_doc *)0x11640e;
            fdb_doc_free(*(fdb_doc **)(auStack_fa8 + lVar25 * 8 + 0x10));
            lVar25 = lVar25 + 1;
          } while (lVar25 != 10);
          pfStack_fc0 = (fdb_doc *)0x116421;
          fdb_kvs_close((fdb_kvs_handle *)auStack_fa8._0_8_);
          pfStack_fc0 = (fdb_doc *)0x11642b;
          fdb_close((fdb_file_handle *)auStack_fa8._8_8_);
          pfStack_fc0 = (fdb_doc *)0x116430;
          fdb_shutdown();
          pfStack_fc0 = (fdb_doc *)0x116435;
          memleak_end();
          pcVar24 = "%s PASSED\n";
          if (doc_compression_test()::__test_pass != '\0') {
            pcVar24 = "%s FAILED\n";
          }
          pfStack_fc0 = (fdb_doc *)0x116466;
          fprintf(_stderr,pcVar24,"document compression test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_001164b8:
    pfStack_fc0 = (fdb_doc *)0x1164bd;
    doc_compression_test();
LAB_001164bd:
    pfStack_fc0 = (fdb_doc *)0x1164c2;
    doc_compression_test();
  }
  pfStack_fc0 = (fdb_doc *)read_doc_by_offset_test;
  doc_compression_test();
  pfStack_1758 = (fdb_doc *)0x1164e4;
  ppfStack_fe8 = ppfVar13;
  pfStack_fe0 = (fdb_kvs_handle *)pcVar24;
  pfStack_fd8 = (fdb_kvs_handle *)handle;
  pbStack_fd0 = pbVar9;
  ppfStack_fc8 = ppfVar8;
  pfStack_fc0 = (fdb_doc *)pcVar21;
  gettimeofday(&tStack_1728,(__timezone_ptr_t)0x0);
  pfStack_1758 = (fdb_doc *)0x1164e9;
  memleak_start();
  pfStack_1758 = (fdb_doc *)0x1164f5;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1758 = (fdb_doc *)0x116505;
  fdb_get_default_config();
  pbVar9 = (btree *)auStack_1718;
  pfStack_1758 = (fdb_doc *)0x116512;
  fdb_get_default_kvs_config();
  fStack_10e0.buffercache_size = 0;
  fStack_10e0.wal_threshold = 0x400;
  fStack_10e0.flags = 1;
  fStack_10e0.purging_interval = 0xe10;
  fStack_10e0.compaction_threshold = '\0';
  ptr_fhandle = (btree_kv_ops *)auStack_1738;
  pfStack_1758 = (fdb_doc *)0x11654b;
  fdb_open((fdb_file_handle **)ptr_fhandle,"./dummy1",&fStack_10e0);
  doc_00 = (btree_kv_ops *)(auStack_1748 + 8);
  pfStack_1758 = (fdb_doc *)0x11655e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1738._0_8_,(fdb_kvs_handle **)doc_00,
             (fdb_kvs_config *)pbVar9);
  pfStack_1758 = (fdb_doc *)0x116574;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1748._8_8_,logCallbackFunc,"read_doc_by_offset_test")
  ;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar25 = 0;
    uVar28 = 0;
    do {
      pfStack_1758 = (fdb_doc *)0x11659c;
      sprintf(acStack_11e0,"key%d",uVar28 & 0xffffffff);
      pfStack_1758 = (fdb_doc *)0x1165b4;
      sprintf((char *)abStack_12e0,"meta%d",uVar28 & 0xffffffff);
      pfStack_1758 = (fdb_doc *)0x1165c9;
      sprintf(auStack_1718 + 0x18,"body%d",uVar28 & 0xffffffff);
      pfStack_1758 = (fdb_doc *)0x1165dc;
      sVar15 = strlen(acStack_11e0);
      pfStack_1758 = (fdb_doc *)0x1165ef;
      sVar5 = strlen((char *)abStack_12e0);
      pfStack_1758 = (fdb_doc *)0x1165fc;
      sVar10 = strlen(auStack_1718 + 0x18);
      pfStack_1758 = (fdb_doc *)0x11661e;
      fdb_doc_create((fdb_doc **)((long)&afStack_1600[0].keylen + lVar25),acStack_11e0,sVar15,
                     abStack_12e0,sVar5,auStack_1718 + 0x18,sVar10);
      pfStack_1758 = (fdb_doc *)0x116630;
      fdb_set((fdb_kvs_handle *)auStack_1748._8_8_,(fdb_doc *)(&afStack_1600[0].keylen)[uVar28]);
      uVar28 = uVar28 + 1;
      lVar25 = lVar25 + 8;
    } while (uVar28 != 100);
    pfStack_1758 = (fdb_doc *)0x11664d;
    fdb_commit((fdb_file_handle *)auStack_1738._0_8_,'\0');
    pbVar9 = abStack_12e0;
    pcVar24 = auStack_1718 + 0x18;
    ptr_fhandle = (btree_kv_ops *)0x0;
    uVar28 = 0;
    do {
      pfStack_1758 = (fdb_doc *)0x116674;
      sprintf((char *)pbVar9,"meta2%d",uVar28 & 0xffffffff);
      pfStack_1758 = (fdb_doc *)0x116688;
      sprintf(pcVar24,"body2%d",uVar28 & 0xffffffff);
      pcVar21 = (char *)((long)&afStack_1600[0].keylen + (long)ptr_fhandle);
      pfStack_1758 = (fdb_doc *)0x11669b;
      sVar15 = strlen((char *)pbVar9);
      pfStack_1758 = (fdb_doc *)0x1166a6;
      sVar5 = strlen(pcVar24);
      pfStack_1758 = (fdb_doc *)0x1166ba;
      fdb_doc_update((fdb_doc **)pcVar21,pbVar9,sVar15,pcVar24,sVar5);
      pfStack_1758 = (fdb_doc *)0x1166cc;
      fdb_set((fdb_kvs_handle *)auStack_1748._8_8_,(fdb_doc *)(&afStack_1600[0].keylen)[uVar28]);
      uVar28 = uVar28 + 1;
      ptr_fhandle = (btree_kv_ops *)((long)ptr_fhandle + 8);
    } while (uVar28 != 0x32);
    doc_00 = (btree_kv_ops *)auStack_1748;
    pfStack_1758 = (fdb_doc *)0x116708;
    fdb_doc_create((fdb_doc **)doc_00,(void *)psStack_1470[4],*psStack_1470,(void *)psStack_1470[7],
                   psStack_1470[1],(void *)0x0,0);
    pfStack_1758 = (fdb_doc *)0x116715;
    fVar3 = fdb_del((fdb_kvs_handle *)auStack_1748._8_8_,(fdb_doc *)auStack_1748._0_8_);
    handle = (code *)0x32;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a3e;
    doc_00 = (btree_kv_ops *)auStack_1748;
    pfStack_1758 = (fdb_doc *)0x11672a;
    fdb_doc_free((fdb_doc *)auStack_1748._0_8_);
    pbVar9 = (btree *)0x0;
    auStack_1748._0_8_ = (btree_kv_ops *)0x0;
    pfStack_1758 = (fdb_doc *)0x11673c;
    fdb_commit((fdb_file_handle *)auStack_1738._0_8_,'\0');
    pfStack_1758 = (fdb_doc *)0x11675f;
    fdb_doc_create((fdb_doc **)doc_00,*(kvs_ops_stat **)(afStack_1600[0].seqnum + 0x20),
                   *(size_t *)(fdb_kvs_config *)afStack_1600[0].seqnum,(void *)0x0,0,(void *)0x0,0);
    pfStack_1758 = (fdb_doc *)0x11676c;
    fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_1748._8_8_,(fdb_doc *)auStack_1748._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a43;
    if (*(char *)(auStack_1748._0_8_ + 0x48) != '\0') {
      pfStack_1758 = (fdb_doc *)0x116789;
      read_doc_by_offset_test();
    }
    doc_00 = (btree_kv_ops *)auStack_1748._0_8_;
    pbVar9 = *(btree **)(auStack_1748._0_8_ + 0x38);
    ptr_fhandle = *(btree_kv_ops **)(afStack_1600[0].seqnum + 0x38);
    pfStack_1758 = (fdb_doc *)0x1167ad;
    iVar4 = bcmp(pbVar9,ptr_fhandle,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(auStack_1748._0_8_ + 8))
    ;
    if (iVar4 != 0) goto LAB_00116a48;
    pfStack_1758 = (fdb_doc *)0x1167c2;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_1748._8_8_,(fdb_doc *)doc_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a53;
    if (*(char *)(auStack_1748._0_8_ + 0x48) != '\0') {
      pfStack_1758 = (fdb_doc *)0x1167df;
      read_doc_by_offset_test();
    }
    pcVar24 = (char *)afStack_1600[0].seqnum;
    ptr_fhandle = (btree_kv_ops *)auStack_1748._0_8_;
    doc_00 = *(btree_kv_ops **)(auStack_1748._0_8_ + 0x38);
    pbVar9 = *(btree **)(afStack_1600[0].seqnum + 0x38);
    pfStack_1758 = (fdb_doc *)0x116804;
    iVar4 = bcmp(doc_00,pbVar9,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(auStack_1748._0_8_ + 8))
    ;
    if (iVar4 != 0) goto LAB_00116a58;
    doc_00 = *(btree_kv_ops **)((long)ptr_fhandle + 0x40);
    pbVar9 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar24 + 0x40))->seqtree;
    pfStack_1758 = (fdb_doc *)0x116824;
    iVar4 = bcmp(doc_00,pbVar9,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                          ((long)ptr_fhandle + 0x10));
    if (iVar4 != 0) goto LAB_00116a63;
    doc_00 = (btree_kv_ops *)(auStack_1738 + 8);
    pfStack_1758 = (fdb_doc *)0x11684d;
    fdb_doc_create((fdb_doc **)doc_00,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(btree_print_func **)(auStack_1738._8_8_ + 0x30) =
         *(btree_print_func **)(auStack_1748._0_8_ + 0x30);
    pfStack_1758 = (fdb_doc *)0x116867;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_1748._8_8_,(fdb_doc *)auStack_1738._8_8_);
    __s2 = (btree_kv_ops *)auStack_1738._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a6e;
    doc_00 = *(btree_kv_ops **)(auStack_1738._8_8_ + 0x20);
    pbVar9 = *(btree **)(afStack_1600[0].seqnum + 0x20);
    pfStack_1758 = (fdb_doc *)0x116893;
    iVar4 = bcmp(doc_00,pbVar9,(size_t)*(size_t *)auStack_1738._8_8_);
    pcVar24 = (char *)afStack_1600[0].seqnum;
    if (iVar4 != 0) goto LAB_00116a73;
    doc_00 = *(btree_kv_ops **)((long)__s2 + 0x38);
    pbVar9 = *(btree **)(afStack_1600[0].seqnum + 0x38);
    pfStack_1758 = (fdb_doc *)0x1168b3;
    iVar4 = bcmp(doc_00,pbVar9,*(bid_t *)((long)__s2 + 8));
    if (iVar4 != 0) goto LAB_00116a7e;
    doc_00 = *(btree_kv_ops **)((long)__s2 + 0x40);
    pbVar9 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(afStack_1600[0].seqnum + 0x40))->
             seqtree;
    pfStack_1758 = (fdb_doc *)0x1168d3;
    iVar4 = bcmp(doc_00,pbVar9,(size_t)*(void **)((long)__s2 + 0x10));
    if (iVar4 != 0) goto LAB_00116a89;
    doc_00 = (btree_kv_ops *)auStack_1748;
    pfStack_1758 = (fdb_doc *)0x1168e8;
    fdb_doc_free((fdb_doc *)auStack_1748._0_8_);
    pbVar9 = (btree *)0x0;
    auStack_1748._0_8_ = (btree_kv_ops *)0x0;
    pfStack_1758 = (fdb_doc *)0x1168f8;
    fdb_doc_free((fdb_doc *)auStack_1738._8_8_);
    pfStack_1758 = (fdb_doc *)0x116909;
    fdb_compact((fdb_file_handle *)auStack_1738._0_8_,"./dummy2");
    pfStack_1758 = (fdb_doc *)0x11692c;
    fdb_doc_create((fdb_doc **)doc_00,(void *)psStack_1470[4],*psStack_1470,(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_1758 = (fdb_doc *)0x116939;
    fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_1748._8_8_,(fdb_doc *)auStack_1748._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a94;
    if (*(char *)(auStack_1748._0_8_ + 0x48) == '\0') {
      pfStack_1758 = (fdb_doc *)0x116956;
      read_doc_by_offset_test();
    }
    doc_00 = (btree_kv_ops *)auStack_1748._0_8_;
    pbVar9 = *(btree **)(auStack_1748._0_8_ + 0x38);
    __s2 = (btree_kv_ops *)psStack_1470[7];
    pfStack_1758 = (fdb_doc *)0x11697a;
    iVar4 = bcmp(pbVar9,__s2,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(auStack_1748._0_8_ + 8))
    ;
    if (iVar4 != 0) goto LAB_00116a99;
    pfStack_1758 = (fdb_doc *)0x11698f;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_1748._8_8_,(fdb_doc *)doc_00);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      if (*(char *)(auStack_1748._0_8_ + 0x48) == '\0') {
        pfStack_1758 = (fdb_doc *)0x1169ad;
        read_doc_by_offset_test();
      }
      pfStack_1758 = (fdb_doc *)0x1169b7;
      fdb_doc_free((fdb_doc *)auStack_1748._0_8_);
      auStack_1748._0_8_ = (_func_void_bnode_ptr_idx_t_void_ptr_void_ptr *)0x0;
      lVar25 = 0;
      do {
        pfStack_1758 = (fdb_doc *)0x1169cf;
        fdb_doc_free((fdb_doc *)(&afStack_1600[0].keylen)[lVar25]);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 100);
      pfStack_1758 = (fdb_doc *)0x1169e2;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1748._8_8_);
      pfStack_1758 = (fdb_doc *)0x1169ec;
      fdb_close((fdb_file_handle *)auStack_1738._0_8_);
      pfStack_1758 = (fdb_doc *)0x1169f1;
      fdb_shutdown();
      pfStack_1758 = (fdb_doc *)0x1169f6;
      memleak_end();
      pcVar24 = "%s PASSED\n";
      if (read_doc_by_offset_test()::__test_pass != '\0') {
        pcVar24 = "%s FAILED\n";
      }
      pfStack_1758 = (fdb_doc *)0x116a27;
      fprintf(_stderr,pcVar24,"read_doc_by_offset test");
      return;
    }
  }
  else {
    pfStack_1758 = (fdb_doc *)0x116a3e;
    read_doc_by_offset_test();
LAB_00116a3e:
    pfStack_1758 = (fdb_doc *)0x116a43;
    read_doc_by_offset_test();
LAB_00116a43:
    pfStack_1758 = (fdb_doc *)0x116a48;
    read_doc_by_offset_test();
LAB_00116a48:
    pfStack_1758 = (fdb_doc *)0x116a53;
    read_doc_by_offset_test();
LAB_00116a53:
    pfStack_1758 = (fdb_doc *)0x116a58;
    read_doc_by_offset_test();
LAB_00116a58:
    pfStack_1758 = (fdb_doc *)0x116a63;
    read_doc_by_offset_test();
LAB_00116a63:
    pfStack_1758 = (fdb_doc *)0x116a6e;
    read_doc_by_offset_test();
LAB_00116a6e:
    __s2 = ptr_fhandle;
    pfStack_1758 = (fdb_doc *)0x116a73;
    read_doc_by_offset_test();
LAB_00116a73:
    pfStack_1758 = (fdb_doc *)0x116a7e;
    read_doc_by_offset_test();
LAB_00116a7e:
    pfStack_1758 = (fdb_doc *)0x116a89;
    read_doc_by_offset_test();
LAB_00116a89:
    pfStack_1758 = (fdb_doc *)0x116a94;
    read_doc_by_offset_test();
LAB_00116a94:
    pfStack_1758 = (fdb_doc *)0x116a99;
    read_doc_by_offset_test();
LAB_00116a99:
    pfStack_1758 = (fdb_doc *)0x116aa4;
    read_doc_by_offset_test();
  }
  pfStack_1758 = (fdb_doc *)purge_logically_deleted_doc_test;
  read_doc_by_offset_test();
  pfStack_1c20 = (fdb_doc *)0x116ac9;
  pbStack_1780 = doc_00;
  pfStack_1778 = (fdb_kvs_handle *)pcVar24;
  pfStack_1770 = (fdb_kvs_handle *)handle;
  pbStack_1768 = pbVar9;
  pfStack_1760 = (fdb_doc *)__s2;
  pfStack_1758 = (fdb_doc *)pcVar21;
  gettimeofday(&tStack_1ba0,(__timezone_ptr_t)0x0);
  pfStack_1c20 = (fdb_doc *)0x116ace;
  memleak_start();
  pfStack_1c10 = (fdb_doc *)0x0;
  pfStack_1c20 = (fdb_doc *)0x116adf;
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  pfStack_1c20 = (fdb_doc *)0x116aef;
  fdb_get_default_config();
  pfVar11 = afStack_1b90;
  pfStack_1c20 = (fdb_doc *)0x116aff;
  fdb_get_default_kvs_config();
  fStack_1878.buffercache_size = 0;
  fStack_1878.wal_threshold = 0x400;
  fStack_1878.flags = 1;
  fStack_1878.purging_interval = 2;
  fStack_1878.compaction_threshold = '\0';
  pbVar9 = (btree *)&pfStack_1c00;
  pfStack_1c20 = (fdb_doc *)0x116b34;
  fdb_open((fdb_file_handle **)pbVar9,"./dummy1",&fStack_1878);
  pfVar12 = (fdb_kvs_handle *)&pfStack_1c08;
  pfStack_1c20 = (fdb_doc *)0x116b47;
  fdb_kvs_open_default(pfStack_1c00,(fdb_kvs_handle **)pfVar12,(fdb_kvs_config *)pfVar11);
  pfStack_1c20 = (fdb_doc *)0x116b5d;
  fVar3 = fdb_set_log_callback(pfStack_1c08,logCallbackFunc,"purge_logically_deleted_doc_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcVar24 = (char *)0x0;
    uVar28 = 0;
    do {
      pfStack_1c20 = (fdb_doc *)0x116b85;
      sprintf(acStack_1978,"key%d",uVar28 & 0xffffffff);
      pfStack_1c20 = (fdb_doc *)0x116b9d;
      sprintf((char *)afStack_1a78,"meta%d",uVar28 & 0xffffffff);
      pfStack_1c20 = (fdb_doc *)0x116bb5;
      sprintf((char *)&afStack_1b90[0].size_ondisk,"body%d",uVar28 & 0xffffffff);
      pbVar9 = (btree *)(auStack_1bf8 + (long)pcVar24);
      pfStack_1c20 = (fdb_doc *)0x116bc5;
      handle = (code *)strlen(acStack_1978);
      pcVar21 = (char *)afStack_1a78;
      pfStack_1c20 = (fdb_doc *)0x116bd8;
      pfVar11 = (fdb_doc *)strlen(pcVar21);
      pfStack_1c20 = (fdb_doc *)0x116be8;
      sVar15 = strlen((char *)&afStack_1b90[0].size_ondisk);
      pfStack_1c20 = (fdb_doc *)0x116c0d;
      fdb_doc_create((fdb_doc **)pbVar9,acStack_1978,(size_t)handle,pcVar21,(size_t)pfVar11,
                     &afStack_1b90[0].size_ondisk,sVar15);
      pfStack_1c20 = (fdb_doc *)0x116c1c;
      fdb_set(pfStack_1c08,*(fdb_doc **)(auStack_1bf8 + uVar28 * 8));
      uVar28 = uVar28 + 1;
      pcVar24 = (char *)((long)pcVar24 + 8);
    } while (uVar28 != 10);
    pfVar12 = (fdb_kvs_handle *)&pfStack_1c10;
    pfStack_1c20 = (fdb_doc *)0x116c59;
    fdb_doc_create((fdb_doc **)pfVar12,*(btree_kv_ops **)(auStack_1bf8._40_8_ + 0x20),
                   *(size_t *)auStack_1bf8._40_8_,*(btree_kv_ops **)(auStack_1bf8._40_8_ + 0x38),
                   *(bid_t *)(auStack_1bf8._40_8_ + 8),(void *)0x0,0);
    pfStack_1c20 = (fdb_doc *)0x116c66;
    fVar3 = fdb_del(pfStack_1c08,pfStack_1c10);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfVar12 = (fdb_kvs_handle *)&pfStack_1c10;
      pfStack_1c20 = (fdb_doc *)0x116c7b;
      fdb_doc_free(pfStack_1c10);
      pfStack_1c10 = (fdb_doc *)0x0;
      pfStack_1c20 = (fdb_doc *)0x116c91;
      fdb_commit(pfStack_1c00,'\0');
      pfStack_1c20 = (fdb_doc *)0x116ca2;
      fdb_compact(pfStack_1c00,"./dummy2");
      handle = (code *)0x0;
      pfVar20 = (fdb_doc *)pcVar21;
      do {
        pfStack_1c20 = (fdb_doc *)0x116cc9;
        fdb_doc_create((fdb_doc **)pfVar12,
                       (void *)(*(size_t **)(auStack_1bf8 + (long)handle * 8))[4],
                       **(size_t **)(auStack_1bf8 + (long)handle * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_1c20 = (fdb_doc *)0x116cd8;
        fVar3 = fdb_get(pfStack_1c08,pfStack_1c10);
        pcVar21 = (char *)pfStack_1c10;
        if ((fdb_kvs_handle *)handle != (fdb_kvs_handle *)0x5) {
          if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00116f87:
            pfStack_1c20 = (fdb_doc *)0x116f8c;
            purge_logically_deleted_doc_test();
            pcVar21 = (char *)pfVar20;
            goto LAB_00116f8c;
          }
          pfVar11 = (fdb_doc *)pfStack_1c10->meta;
          pfVar14 = *(fdb_kvs_handle **)(auStack_1bf8 + (long)handle * 8);
          pbVar9 = pfVar14->staletree;
          pfStack_1c20 = (fdb_doc *)0x116d14;
          iVar4 = bcmp(pfVar11,pbVar9,pfStack_1c10->metalen);
          pcVar24 = (char *)pfVar12;
          if (iVar4 == 0) {
            pfVar11 = (fdb_doc *)((fdb_doc *)pcVar21)->body;
            pbVar9 = (pfVar14->field_6).seqtree;
            pfStack_1c20 = (fdb_doc *)0x116d33;
            iVar4 = bcmp(pfVar11,pbVar9,((fdb_doc *)pcVar21)->bodylen);
            if (iVar4 == 0) goto LAB_00116d44;
LAB_00116f7c:
            pfStack_1c20 = (fdb_doc *)0x116f87;
            purge_logically_deleted_doc_test();
            pfVar20 = (fdb_doc *)pcVar21;
            goto LAB_00116f87;
          }
LAB_00116f91:
          pfStack_1c20 = (fdb_doc *)0x116f9c;
          purge_logically_deleted_doc_test();
          goto LAB_00116f9c;
        }
        pcVar21 = (char *)pfVar20;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) {
LAB_00116f8c:
          pfStack_1c20 = (fdb_doc *)0x116f91;
          purge_logically_deleted_doc_test();
          pfVar14 = pfVar12;
          pcVar24 = (char *)(fdb_kvs_handle *)0x0;
          goto LAB_00116f91;
        }
LAB_00116d44:
        pcVar24 = (char *)0x0;
        pfStack_1c20 = (fdb_doc *)0x116d4e;
        fdb_doc_free(pfStack_1c10);
        pfStack_1c10 = (fdb_doc *)0x0;
        pfStack_1c20 = (fdb_doc *)0x116d73;
        fdb_doc_create((fdb_doc **)pfVar12,
                       (void *)(*(size_t **)(auStack_1bf8 + (long)handle * 8))[4],
                       **(size_t **)(auStack_1bf8 + (long)handle * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_1c20 = (fdb_doc *)0x116d82;
        fVar3 = fdb_get_metaonly(pfStack_1c08,pfStack_1c10);
        if ((fdb_kvs_handle *)handle == (fdb_kvs_handle *)0x5) {
          if ((fVar3 != FDB_RESULT_KEY_NOT_FOUND) && (fVar3 != FDB_RESULT_SUCCESS))
          goto LAB_00116fc6;
        }
        else if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_1c20 = (fdb_doc *)0x116f7c;
          purge_logically_deleted_doc_test();
          goto LAB_00116f7c;
        }
        pfStack_1c20 = (fdb_doc *)0x116da8;
        fdb_doc_free(pfStack_1c10);
        pfStack_1c10 = (fdb_doc *)0x0;
        handle = (code *)&(((fdb_kvs_handle *)handle)->kvs_config).field_0x1;
        pfVar20 = (fdb_doc *)pcVar21;
      } while (handle != (code *)0xa);
      pfStack_1c20 = (fdb_doc *)0x116dca;
      puts("wait for 3 seconds..");
      pfStack_1c20 = (fdb_doc *)0x116dd4;
      sleep(3);
      pfStack_1c20 = (fdb_doc *)0x116de5;
      fdb_compact(pfStack_1c00,"./dummy3");
      pfVar14 = (fdb_kvs_handle *)&pfStack_1c10;
      handle = (code *)0x0;
      do {
        pcVar24 = (char *)0x0;
        pfStack_1c20 = (fdb_doc *)0x116e14;
        fdb_doc_create((fdb_doc **)pfVar14,
                       (void *)(*(size_t **)(auStack_1bf8 + (long)handle * 8))[4],
                       **(size_t **)(auStack_1bf8 + (long)handle * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_1c20 = (fdb_doc *)0x116e23;
        fVar3 = fdb_get(pfStack_1c08,pfStack_1c10);
        pfVar20 = pfStack_1c10;
        if ((fdb_kvs_handle *)handle == (fdb_kvs_handle *)0x5) {
          pfVar20 = (fdb_doc *)pcVar21;
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116fa1;
        }
        else {
          if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116f9c;
          pfVar11 = (fdb_doc *)pfStack_1c10->meta;
          pcVar24 = *(char **)(auStack_1bf8 + (long)handle * 8);
          pbVar9 = ((fdb_kvs_handle *)pcVar24)->staletree;
          pfStack_1c20 = (fdb_doc *)0x116e5d;
          iVar4 = bcmp(pfVar11,pbVar9,pfStack_1c10->metalen);
          if (iVar4 != 0) goto LAB_00116fab;
          pfVar11 = (fdb_doc *)pfVar20->body;
          pbVar9 = (((fdb_kvs_handle *)pcVar24)->field_6).seqtree;
          pfStack_1c20 = (fdb_doc *)0x116e7d;
          iVar4 = bcmp(pfVar11,pbVar9,pfVar20->bodylen);
          pcVar24 = (char *)0x0;
          if (iVar4 != 0) goto LAB_00116fbb;
        }
        pcVar24 = (char *)0x0;
        pfStack_1c20 = (fdb_doc *)0x116e95;
        fdb_doc_free(pfStack_1c10);
        pfStack_1c10 = (fdb_doc *)0x0;
        pfStack_1c20 = (fdb_doc *)0x116eba;
        fdb_doc_create((fdb_doc **)pfVar14,
                       (void *)(*(size_t **)(auStack_1bf8 + (long)handle * 8))[4],
                       **(size_t **)(auStack_1bf8 + (long)handle * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_1c20 = (fdb_doc *)0x116ec9;
        fVar3 = fdb_get_metaonly(pfStack_1c08,pfStack_1c10);
        if ((fdb_kvs_handle *)handle == (fdb_kvs_handle *)0x5) {
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116fa6;
        }
        else if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116fb6;
        pfStack_1c20 = (fdb_doc *)0x116eeb;
        fdb_doc_free(pfStack_1c10);
        pfStack_1c10 = (fdb_doc *)0x0;
        handle = (code *)&(((fdb_kvs_handle *)handle)->kvs_config).field_0x1;
        pcVar21 = (char *)pfVar20;
        if (handle == (code *)0xa) {
          pfStack_1c20 = (fdb_doc *)0x116f0b;
          fdb_kvs_close(pfStack_1c08);
          pfStack_1c20 = (fdb_doc *)0x116f15;
          fdb_close(pfStack_1c00);
          lVar25 = 0;
          do {
            pfStack_1c20 = (fdb_doc *)0x116f21;
            fdb_doc_free(*(fdb_doc **)(auStack_1bf8 + lVar25 * 8));
            lVar25 = lVar25 + 1;
          } while (lVar25 != 10);
          pfStack_1c20 = (fdb_doc *)0x116f2f;
          fdb_shutdown();
          pfStack_1c20 = (fdb_doc *)0x116f34;
          memleak_end();
          pcVar24 = "%s PASSED\n";
          if (purge_logically_deleted_doc_test()::__test_pass != '\0') {
            pcVar24 = "%s FAILED\n";
          }
          pfStack_1c20 = (fdb_doc *)0x116f65;
          fprintf(_stderr,pcVar24,"purge logically deleted doc test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_00116fcb:
    pfStack_1c20 = (fdb_doc *)0x116fd0;
    purge_logically_deleted_doc_test();
  }
  pfStack_1c20 = (fdb_doc *)api_wrapper_test;
  purge_logically_deleted_doc_test();
  pfStack_20a8 = (fdb_doc *)0x116ff2;
  pfStack_1c48 = pfVar12;
  pfStack_1c40 = (fdb_kvs_handle *)pcVar24;
  pfStack_1c38 = (fdb_kvs_handle *)handle;
  pfStack_1c30 = pfVar11;
  pbStack_1c28 = pbVar9;
  pfStack_1c20 = (fdb_doc *)pcVar21;
  gettimeofday((timeval *)(auStack_2088 + 0x10),(__timezone_ptr_t)0x0);
  pfStack_20a8 = (fdb_doc *)0x116ff7;
  memleak_start();
  pfStack_20a8 = (fdb_doc *)0x117003;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_20a8 = (fdb_doc *)0x117013;
  fdb_get_default_config();
  pfVar14 = (fdb_kvs_handle *)auStack_2068;
  pfStack_20a8 = (fdb_doc *)0x117020;
  fdb_get_default_kvs_config();
  afStack_1e48[0].buffercache_size = 0;
  afStack_1e48[0].wal_threshold = 0x400;
  afStack_1e48[0].flags = 1;
  afStack_1e48[0].purging_interval = 0;
  afStack_1e48[0].compaction_threshold = '\0';
  pcVar27 = auStack_2088 + 8;
  pfStack_20a8 = (fdb_doc *)0x117059;
  fdb_open((fdb_file_handle **)pcVar27,"./dummy1",afStack_1e48);
  pfVar12 = (fdb_kvs_handle *)&pfStack_2098;
  pfStack_20a8 = (fdb_doc *)0x11706c;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2088._8_8_,(fdb_kvs_handle **)pfVar12,
             (fdb_kvs_config *)pfVar14);
  pfStack_20a8 = (fdb_doc *)0x117082;
  fVar3 = fdb_set_log_callback(pfStack_2098,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_20a8 = (fdb_doc *)0x11709d;
    fVar3 = fdb_set_kv(pfStack_2098,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172ef;
    __s = auStack_2068 + 0x18;
    pcVar27 = "body%d";
    pcVar24 = (char *)(afStack_1e48 + 1);
    pcVar21 = (char *)0x0;
    do {
      pfStack_20a8 = (fdb_doc *)0x1170cf;
      sprintf(__s,"key%d",pcVar21);
      pfStack_20a8 = (fdb_doc *)0x1170de;
      sprintf(pcVar24,"body%d",pcVar21);
      handle = (code *)pfStack_2098;
      pfStack_20a8 = (fdb_doc *)0x1170eb;
      pfVar12 = (fdb_kvs_handle *)strlen(__s);
      pfStack_20a8 = (fdb_doc *)0x1170f6;
      sVar15 = strlen(pcVar24);
      pfStack_20a8 = (fdb_doc *)0x11710a;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle,__s,(size_t)pfVar12,pcVar24,sVar15);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_20a8 = (fdb_doc *)0x1172d0;
        api_wrapper_test();
        goto LAB_001172d0;
      }
      uVar26 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar26;
    } while (uVar26 != 10);
    pfVar12 = (fdb_kvs_handle *)(auStack_2068 + 0x18);
    pfStack_20a8 = (fdb_doc *)0x117134;
    sprintf((char *)pfVar12,"key%d",5);
    pfVar14 = pfStack_2098;
    pfStack_20a8 = (fdb_doc *)0x117141;
    sVar15 = strlen((char *)pfVar12);
    pfStack_20a8 = (fdb_doc *)0x11714f;
    fVar3 = fdb_del_kv(pfVar14,pfVar12,sVar15);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001172f4;
    pfStack_20a8 = (fdb_doc *)0x117165;
    fVar3 = fdb_del_kv(pfStack_2098,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172f9;
    pfVar14 = (fdb_kvs_handle *)(auStack_2068 + 0x18);
    pcVar27 = (char *)&pfStack_2090;
    pcVar24 = auStack_2088;
    pcVar21 = (char *)afStack_1f50;
    handle = (code *)0x0;
    do {
      pfStack_20a8 = (fdb_doc *)0x11719c;
      sprintf((char *)pfVar14,"key%d",handle);
      pfVar12 = pfStack_2098;
      pfStack_20a8 = (fdb_doc *)0x1171a9;
      sVar15 = strlen((char *)pfVar14);
      pfStack_20a8 = (fdb_doc *)0x1171bd;
      fVar3 = fdb_get_kv(pfVar12,pfVar14,sVar15,(void **)pcVar27,(size_t *)pcVar24);
      if ((int)handle == 5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001172e5;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001172e0;
        pfStack_20a8 = (fdb_doc *)0x1171e9;
        sprintf(pcVar21,"body%d",handle);
        pfVar12 = pfStack_2090;
        pfStack_20a8 = (fdb_doc *)0x1171fe;
        iVar4 = bcmp(pfStack_2090,pcVar21,auStack_2088._0_8_);
        if (iVar4 != 0) goto LAB_001172d0;
        pfStack_20a8 = (fdb_doc *)0x11720e;
        fdb_free_block(pfVar12);
      }
      uVar26 = (int)handle + 1;
      handle = (code *)(ulong)uVar26;
    } while (uVar26 != 10);
    pfStack_20a8 = (fdb_doc *)0x117233;
    fVar3 = fdb_get_kv(pfStack_2098,(void *)0x0,0,&pfStack_2090,(size_t *)auStack_2088);
    pfVar17 = pfStack_2098;
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172fe;
    pfVar14 = (fdb_kvs_handle *)(auStack_2068 + 0x18);
    pfStack_20a8 = (fdb_doc *)0x11724e;
    sVar15 = strlen((char *)pfVar14);
    pfStack_20a8 = (fdb_doc *)0x117261;
    fVar3 = fdb_get_kv(pfVar17,pfVar14,sVar15,(void **)0x0,(size_t *)0x0);
    if (fVar3 == FDB_RESULT_INVALID_ARGS) {
      pfStack_20a8 = (fdb_doc *)0x117274;
      fdb_kvs_close(pfStack_2098);
      pfStack_20a8 = (fdb_doc *)0x11727e;
      fdb_close((fdb_file_handle *)auStack_2088._8_8_);
      pfStack_20a8 = (fdb_doc *)0x117283;
      fdb_shutdown();
      pfStack_20a8 = (fdb_doc *)0x117288;
      memleak_end();
      pcVar24 = "%s PASSED\n";
      if (api_wrapper_test()::__test_pass != '\0') {
        pcVar24 = "%s FAILED\n";
      }
      pfStack_20a8 = (fdb_doc *)0x1172b9;
      fprintf(_stderr,pcVar24,"API wrapper test");
      return;
    }
  }
  else {
LAB_001172ea:
    pfStack_20a8 = (fdb_doc *)0x1172ef;
    api_wrapper_test();
LAB_001172ef:
    pfStack_20a8 = (fdb_doc *)0x1172f4;
    api_wrapper_test();
LAB_001172f4:
    pfStack_20a8 = (fdb_doc *)0x1172f9;
    api_wrapper_test();
LAB_001172f9:
    pfStack_20a8 = (fdb_doc *)0x1172fe;
    api_wrapper_test();
LAB_001172fe:
    pfVar17 = pfVar12;
    pfStack_20a8 = (fdb_doc *)0x117303;
    api_wrapper_test();
  }
  pfStack_20a8 = (fdb_doc *)flush_before_commit_test;
  api_wrapper_test();
  pfStack_2630 = (fdb_doc *)0x117325;
  pfStack_20d0 = pfVar17;
  pfStack_20c8 = (fdb_kvs_handle *)pcVar24;
  pfStack_20c0 = (fdb_kvs_handle *)handle;
  pfStack_20b8 = pfVar14;
  ppfStack_20b0 = (fdb_kvs_handle **)pcVar27;
  pfStack_20a8 = (fdb_doc *)pcVar21;
  gettimeofday(&tStack_25f8,(__timezone_ptr_t)0x0);
  pfStack_2630 = (fdb_doc *)0x11732a;
  memleak_start();
  pfStack_2630 = (fdb_doc *)0x117336;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_2630 = (fdb_doc *)0x117346;
  fdb_get_default_config();
  pfStack_2630 = (fdb_doc *)0x117356;
  fdb_get_default_kvs_config();
  fStack_23d0.buffercache_size = 0;
  fStack_23d0.wal_threshold = 5;
  fStack_23d0.flags = 1;
  fStack_23d0.purging_interval = 0;
  fStack_23d0.compaction_threshold = '\0';
  fStack_23d0.wal_flush_before_commit = true;
  pfStack_2630 = (fdb_doc *)0x11739a;
  fdb_open(&pfStack_2610,"dummy1",&fStack_23d0);
  pfStack_2630 = (fdb_doc *)0x1173ad;
  fdb_open(&pfStack_2618,"dummy1",&fStack_23d0);
  pfStack_2630 = (fdb_doc *)0x1173be;
  fdb_kvs_open_default(pfStack_2610,&pfStack_2600,&fStack_24f0);
  pfStack_2630 = (fdb_doc *)0x1173d2;
  fdb_kvs_open_default(pfStack_2618,&pfStack_2608,&fStack_24f0);
  pfStack_2630 = (fdb_doc *)0x1173e8;
  fVar3 = fdb_set_log_callback(pfStack_2608,logCallbackFunc,"flush_before_commit_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar19 = apfStack_25e8;
    uVar28 = 0;
    do {
      pfStack_2630 = (fdb_doc *)0x117414;
      sprintf(acStack_24d8,"key%d",uVar28 & 0xffffffff);
      pfStack_2630 = (fdb_doc *)0x117430;
      sprintf(acStack_21d8,"meta%d",uVar28 & 0xffffffff);
      pfStack_2630 = (fdb_doc *)0x11744c;
      sprintf(acStack_22d8,"body%d",uVar28 & 0xffffffff);
      pfStack_2630 = (fdb_doc *)0x117454;
      sVar15 = strlen(acStack_24d8);
      pfStack_2630 = (fdb_doc *)0x11745f;
      sVar5 = strlen(acStack_21d8);
      pfStack_2630 = (fdb_doc *)0x11746a;
      sVar10 = strlen(acStack_22d8);
      pfStack_2630 = (fdb_doc *)0x11748a;
      fdb_doc_create(ppfVar19,acStack_24d8,sVar15,acStack_21d8,sVar5,acStack_22d8,sVar10);
      uVar28 = uVar28 + 1;
      ppfVar19 = ppfVar19 + 1;
    } while (uVar28 != 0x1e);
    pfStack_2630 = (fdb_doc *)0x1174aa;
    fdb_begin_transaction(pfStack_2618,'\x02');
    lVar25 = 0;
    do {
      pfStack_2630 = (fdb_doc *)0x1174bb;
      fdb_set(pfStack_2600,apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 == 1);
    lVar25 = 0;
    pfStack_2630 = (fdb_doc *)0x1174d2;
    fdb_commit(pfStack_2610,'\0');
    do {
      pfStack_2630 = (fdb_doc *)0x1174e1;
      fdb_set(pfStack_2608,apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 == 1);
    lVar25 = 0;
    pfStack_2630 = (fdb_doc *)0x1174f8;
    fdb_end_transaction(pfStack_2618,'\0');
    pfStack_2630 = (fdb_doc *)0x117507;
    fdb_commit(pfStack_2610,'\x01');
    pfStack_2630 = (fdb_doc *)0x117516;
    fdb_begin_transaction(pfStack_2618,'\x02');
    do {
      pfStack_2630 = (fdb_doc *)0x117525;
      fdb_set(pfStack_2608,apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 == 1);
    lVar25 = 0;
    pfStack_2630 = (fdb_doc *)0x11753c;
    fdb_end_transaction(pfStack_2618,'\0');
    do {
      pfStack_2630 = (fdb_doc *)0x11754b;
      fdb_set(pfStack_2600,apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 == 1);
    lVar25 = 0;
    pfStack_2630 = (fdb_doc *)0x117562;
    fdb_commit(pfStack_2610,'\0');
    pfStack_2630 = (fdb_doc *)0x117571;
    fdb_commit(pfStack_2610,'\x01');
    pfStack_2630 = (fdb_doc *)0x117580;
    fdb_begin_transaction(pfStack_2618,'\x02');
    do {
      pfStack_2630 = (fdb_doc *)0x11758f;
      fdb_set(pfStack_2608,apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 == 1);
    lVar25 = 0;
    do {
      pfStack_2630 = (fdb_doc *)0x1175a9;
      fdb_set(pfStack_2600,apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 == 1);
    lVar25 = 0;
    pfStack_2630 = (fdb_doc *)0x1175c0;
    fdb_commit(pfStack_2610,'\0');
    pfStack_2630 = (fdb_doc *)0x1175cc;
    fdb_end_transaction(pfStack_2618,'\0');
    pfStack_2630 = (fdb_doc *)0x1175db;
    fdb_commit(pfStack_2610,'\x01');
    pfStack_2630 = (fdb_doc *)0x1175ea;
    fdb_begin_transaction(pfStack_2618,'\x02');
    do {
      pfStack_2630 = (fdb_doc *)0x1175f9;
      fdb_set(pfStack_2600,apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 == 1);
    lVar25 = 0;
    do {
      pfStack_2630 = (fdb_doc *)0x117613;
      fdb_set(pfStack_2608,apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 == 1);
    lVar25 = 0;
    pfStack_2630 = (fdb_doc *)0x11762a;
    fdb_end_transaction(pfStack_2618,'\0');
    pfStack_2630 = (fdb_doc *)0x117636;
    fdb_commit(pfStack_2610,'\0');
    pfStack_2630 = (fdb_doc *)0x117645;
    fdb_commit(pfStack_2610,'\x01');
    pfStack_2630 = (fdb_doc *)0x117654;
    fdb_begin_transaction(pfStack_2618,'\x02');
    do {
      pfStack_2630 = (fdb_doc *)0x117663;
      fdb_set(pfStack_2608,apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 10);
    lVar25 = 0;
    do {
      pfStack_2630 = (fdb_doc *)0x117680;
      fdb_set(pfStack_2600,apfStack_25e8[lVar25 + 10]);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 10);
    pfStack_2630 = (fdb_doc *)0x11769a;
    fdb_compact(pfStack_2610,"dummy2");
    lVar25 = 0;
    do {
      pfStack_2630 = (fdb_doc *)0x1176ae;
      fdb_set(pfStack_2608,apfStack_25e8[lVar25 + 0x14]);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 5);
    lVar25 = 0;
    pfStack_2630 = (fdb_doc *)0x1176c5;
    fdb_end_transaction(pfStack_2618,'\0');
    do {
      pfStack_2630 = (fdb_doc *)0x1176d7;
      fdb_set(pfStack_2600,apfStack_25e8[lVar25 + 0x19]);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 5);
    pfStack_2630 = (fdb_doc *)0x1176ea;
    fdb_close(pfStack_2610);
    pfStack_2630 = (fdb_doc *)0x1176f4;
    fdb_close(pfStack_2618);
    lVar25 = 0;
    do {
      pfStack_2630 = (fdb_doc *)0x117700;
      fdb_doc_free(apfStack_25e8[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x1e);
    pfStack_2630 = (fdb_doc *)0x11770e;
    fdb_shutdown();
    pfStack_2630 = (fdb_doc *)0x117713;
    memleak_end();
    pcVar24 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar24 = "%s FAILED\n";
    }
    pfStack_2630 = (fdb_doc *)0x117744;
    fprintf(_stderr,pcVar24,"flush before commit test");
    return;
  }
  pfStack_2630 = (fdb_doc *)flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_2638 = "dummy1";
  pfStack_2b08 = (fdb_encryption_key *)0x11777e;
  pfStack_2658 = &fStack_24f0;
  ppfStack_2650 = &pfStack_2610;
  ppfStack_2648 = &pfStack_2618;
  ppfStack_2640 = &pfStack_2608;
  pfStack_2630 = (fdb_doc *)pcVar21;
  gettimeofday(&tStack_2a60,(__timezone_ptr_t)0x0);
  pfStack_2b08 = (fdb_encryption_key *)0x117783;
  memleak_start();
  pfStack_2af8 = (fdb_doc *)0x0;
  pfStack_2b08 = (fdb_encryption_key *)0x117794;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_2b08 = (fdb_encryption_key *)0x1177a4;
  fdb_get_default_config();
  fStack_2750.buffercache_size = 0;
  fStack_2750.wal_threshold = 8;
  fStack_2750.flags = 1;
  fStack_2750.purging_interval = 0;
  fStack_2750.compaction_threshold = '\0';
  fStack_2750.wal_flush_before_commit = true;
  pfStack_2b08 = (fdb_encryption_key *)0x1177d6;
  fdb_get_default_kvs_config();
  pfStack_2b08 = (fdb_encryption_key *)0x1177ed;
  fdb_open(&pfStack_2ae0,"dummy1",&fStack_2750);
  pfStack_2b08 = (fdb_encryption_key *)0x1177ff;
  fdb_kvs_open(pfStack_2ae0,&pfStack_2af0,(char *)0x0,&fStack_2a78);
  lVar25 = 0;
  uVar28 = 0;
  do {
    ppfVar13 = &fStack_2a50.bub_ctx.handle;
    pfStack_2b08 = (fdb_encryption_key *)0x11781f;
    sprintf((char *)ppfVar13,"key%d",uVar28 & 0xffffffff);
    pfStack_2b08 = (fdb_encryption_key *)0x117837;
    sprintf((char *)&fStack_2a50.config.encryption_key,"meta%d",uVar28 & 0xffffffff);
    pfStack_2b08 = (fdb_encryption_key *)0x11784f;
    sprintf((char *)&fStack_2a50,"body%d",uVar28 & 0xffffffff);
    pfStack_2b08 = (fdb_encryption_key *)0x11785f;
    sVar15 = strlen((char *)ppfVar13);
    pfVar22 = &fStack_2a50.config.encryption_key;
    pfStack_2b08 = (fdb_encryption_key *)0x117872;
    sVar5 = strlen((char *)pfVar22);
    pfStack_2b08 = (fdb_encryption_key *)0x117882;
    sVar10 = strlen((char *)&fStack_2a50);
    pfStack_2b08 = (fdb_encryption_key *)0x1178a7;
    fdb_doc_create((fdb_doc **)((long)apfStack_2ad0 + lVar25),&fStack_2a50.bub_ctx.handle,sVar15,
                   pfVar22,sVar5,&fStack_2a50,sVar10);
    pfStack_2b08 = (fdb_encryption_key *)0x1178b6;
    fdb_set(pfStack_2af0,apfStack_2ad0[uVar28]);
    uVar28 = uVar28 + 1;
    lVar25 = lVar25 + 8;
  } while (uVar28 != 10);
  pfStack_2b08 = (fdb_encryption_key *)0x1178d6;
  fdb_commit(pfStack_2ae0,'\x01');
  pfStack_2b08 = (fdb_encryption_key *)0x1178f2;
  fdb_open(&pfStack_2ad8,"dummy1",&fStack_2750);
  pfStack_2b08 = (fdb_encryption_key *)0x117909;
  fdb_kvs_open(pfStack_2ad8,&pfStack_2ae8,(char *)0x0,&fStack_2a78);
  pfVar22 = &fStack_2a50.config.encryption_key;
  lVar25 = 0;
  uVar28 = 0;
  do {
    pfStack_2b08 = (fdb_encryption_key *)0x117932;
    sprintf((char *)pfVar22,"meta2%d",uVar28 & 0xffffffff);
    pfStack_2b08 = (fdb_encryption_key *)0x117946;
    sprintf((char *)&fStack_2a50,"body2%d(db2)",uVar28 & 0xffffffff);
    pfStack_2b08 = (fdb_encryption_key *)0x117956;
    sVar15 = strlen((char *)pfVar22);
    pfStack_2b08 = (fdb_encryption_key *)0x117961;
    sVar5 = strlen((char *)&fStack_2a50);
    pfStack_2b08 = (fdb_encryption_key *)0x117975;
    fdb_doc_update((fdb_doc **)((long)apfStack_2ad0 + lVar25),pfVar22,sVar15,&fStack_2a50,sVar5);
    pfStack_2b08 = (fdb_encryption_key *)0x117984;
    fdb_set(pfStack_2ae8,apfStack_2ad0[uVar28]);
    uVar28 = uVar28 + 1;
    lVar25 = lVar25 + 8;
  } while (uVar28 != 5);
  uVar28 = 5;
  lVar25 = 0x28;
  pfVar22 = &fStack_2a50.config.encryption_key;
  pfVar12 = &fStack_2a50;
  do {
    pfStack_2b08 = (fdb_encryption_key *)0x1179c6;
    sprintf((char *)pfVar22,"meta2%d",uVar28 & 0xffffffff);
    pfStack_2b08 = (fdb_encryption_key *)0x1179d5;
    sprintf((char *)pfVar12,"body2%d(db1)",uVar28 & 0xffffffff);
    pfStack_2b08 = (fdb_encryption_key *)0x1179e5;
    sVar15 = strlen((char *)pfVar22);
    pfStack_2b08 = (fdb_encryption_key *)0x1179f0;
    sVar5 = strlen((char *)pfVar12);
    pfStack_2b08 = (fdb_encryption_key *)0x117a0b;
    fdb_doc_update((fdb_doc **)((long)apfStack_2ad0 + lVar25),pfVar22,sVar15,pfVar12,sVar5);
    pfStack_2b08 = (fdb_encryption_key *)0x117a1a;
    fdb_set(pfStack_2af0,apfStack_2ad0[uVar28]);
    uVar28 = uVar28 + 1;
    lVar25 = lVar25 + 8;
  } while (uVar28 != 10);
  ppfVar13 = &fStack_2a50.bub_ctx.handle;
  pfVar22 = &fStack_2a50.config.encryption_key;
  uVar28 = 0;
  do {
    pcVar24 = "body2%d(db1)";
    pfStack_2b08 = (fdb_encryption_key *)0x117a54;
    sprintf((char *)ppfVar13,"key%d",uVar28);
    pfStack_2b08 = (fdb_encryption_key *)0x117a67;
    sprintf((char *)pfVar22,"meta2%d",uVar28);
    if ((uint)uVar28 < 5) {
      pcVar24 = "body2%d(db2)";
    }
    pfStack_2b08 = (fdb_encryption_key *)0x117a84;
    sprintf((char *)&fStack_2a50,pcVar24,uVar28);
    pfStack_2b08 = (fdb_encryption_key *)0x117a8c;
    sVar15 = strlen((char *)ppfVar13);
    pfStack_2b08 = (fdb_encryption_key *)0x117aac;
    fdb_doc_create(&pfStack_2af8,ppfVar13,sVar15,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b08 = (fdb_encryption_key *)0x117abb;
    fVar3 = fdb_get(pfStack_2af0,pfStack_2af8);
    pfVar11 = pfStack_2af8;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00117dc9:
      pfStack_2b08 = (fdb_encryption_key *)0x117dce;
      flush_before_commit_multi_writers_test();
LAB_00117dce:
      pfStack_2b08 = (fdb_encryption_key *)0x117dd3;
      flush_before_commit_multi_writers_test();
      pfVar11 = (fdb_doc *)pcVar24;
LAB_00117dd3:
      pfStack_2b08 = (fdb_encryption_key *)0x117de3;
      flush_before_commit_multi_writers_test();
LAB_00117de3:
      pfStack_2b08 = (fdb_encryption_key *)0x117df3;
      flush_before_commit_multi_writers_test();
LAB_00117df3:
      pfStack_2b08 = (fdb_encryption_key *)0x117e03;
      flush_before_commit_multi_writers_test();
      goto LAB_00117e03;
    }
    pfVar12 = (fdb_kvs_handle *)pfStack_2af8->meta;
    pfStack_2b08 = (fdb_encryption_key *)0x117adb;
    iVar4 = bcmp(pfVar22,pfVar12,pfStack_2af8->metalen);
    if (iVar4 != 0) {
      pfStack_2b08 = (fdb_encryption_key *)0x117dc9;
      flush_before_commit_multi_writers_test();
      pcVar24 = (char *)pfVar11;
      goto LAB_00117dc9;
    }
    pfVar12 = (fdb_kvs_handle *)pfVar11->body;
    pfStack_2b08 = (fdb_encryption_key *)0x117af6;
    iVar4 = bcmp(&fStack_2a50,pfVar12,pfVar11->bodylen);
    if (iVar4 != 0) goto LAB_00117dd3;
    pfStack_2b08 = (fdb_encryption_key *)0x117b06;
    fdb_doc_free(pfVar11);
    pcVar24 = (char *)0x0;
    pfStack_2af8 = (fdb_doc *)0x0;
    pfStack_2b08 = (fdb_encryption_key *)0x117b16;
    sVar15 = strlen((char *)ppfVar13);
    pfStack_2b08 = (fdb_encryption_key *)0x117b32;
    fdb_doc_create(&pfStack_2af8,ppfVar13,sVar15,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b08 = (fdb_encryption_key *)0x117b41;
    fVar3 = fdb_get(pfStack_2ae8,pfStack_2af8);
    pfVar11 = pfStack_2af8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dce;
    pfVar12 = (fdb_kvs_handle *)pfStack_2af8->meta;
    pfStack_2b08 = (fdb_encryption_key *)0x117b61;
    iVar4 = bcmp(pfVar22,pfVar12,pfStack_2af8->metalen);
    if (iVar4 != 0) goto LAB_00117df3;
    pfVar12 = (fdb_kvs_handle *)pfVar11->body;
    pfStack_2b08 = (fdb_encryption_key *)0x117b7c;
    iVar4 = bcmp(&fStack_2a50,pfVar12,pfVar11->bodylen);
    if (iVar4 != 0) goto LAB_00117de3;
    pfStack_2b08 = (fdb_encryption_key *)0x117b8c;
    fdb_doc_free(pfVar11);
    pfStack_2af8 = (fdb_doc *)0x0;
    uVar26 = (uint)uVar28 + 1;
    uVar28 = (ulong)uVar26;
  } while (uVar26 != 10);
  pfStack_2b08 = (fdb_encryption_key *)0x117bb3;
  fdb_commit(pfStack_2ae0,'\0');
  pfStack_2b08 = (fdb_encryption_key *)0x117bbf;
  fdb_commit(pfStack_2ad8,'\0');
  ppfVar13 = &fStack_2a50.bub_ctx.handle;
  pfVar22 = &fStack_2a50.config.encryption_key;
  uVar28 = 0;
  while( true ) {
    pfStack_2b08 = (fdb_encryption_key *)0x117bf3;
    sprintf((char *)ppfVar13,"key%d",uVar28);
    pfStack_2b08 = (fdb_encryption_key *)0x117c06;
    sprintf((char *)pfVar22,"meta2%d",uVar28);
    pcVar24 = "body2%d(db1)";
    if ((uint)uVar28 < 5) {
      pcVar24 = "body2%d(db2)";
    }
    pfStack_2b08 = (fdb_encryption_key *)0x117c20;
    sprintf((char *)&fStack_2a50,pcVar24,uVar28);
    pfStack_2b08 = (fdb_encryption_key *)0x117c28;
    sVar15 = strlen((char *)ppfVar13);
    pfStack_2b08 = (fdb_encryption_key *)0x117c48;
    fdb_doc_create(&pfStack_2af8,ppfVar13,sVar15,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b08 = (fdb_encryption_key *)0x117c57;
    fVar3 = fdb_get(pfStack_2af0,pfStack_2af8);
    pfVar11 = pfStack_2af8;
    pfVar20 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar12 = (fdb_kvs_handle *)pfStack_2af8->meta;
    pfStack_2b08 = (fdb_encryption_key *)0x117c77;
    iVar4 = bcmp(pfVar22,pfVar12,pfStack_2af8->metalen);
    if (iVar4 != 0) goto LAB_00117e03;
    pfVar12 = (fdb_kvs_handle *)pfVar11->body;
    pfStack_2b08 = (fdb_encryption_key *)0x117c92;
    iVar4 = bcmp(&fStack_2a50,pfVar12,pfVar11->bodylen);
    if (iVar4 != 0) goto LAB_00117e1d;
    pfStack_2b08 = (fdb_encryption_key *)0x117ca2;
    fdb_doc_free(pfVar11);
    pfVar20 = (fdb_doc *)0x0;
    pfStack_2af8 = (fdb_doc *)0x0;
    pfStack_2b08 = (fdb_encryption_key *)0x117cb2;
    sVar15 = strlen((char *)ppfVar13);
    pfStack_2b08 = (fdb_encryption_key *)0x117cce;
    fdb_doc_create(&pfStack_2af8,ppfVar13,sVar15,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b08 = (fdb_encryption_key *)0x117cdd;
    fVar3 = fdb_get(pfStack_2ae8,pfStack_2af8);
    pfVar11 = pfStack_2af8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e18;
    pfVar12 = (fdb_kvs_handle *)pfStack_2af8->meta;
    pfStack_2b08 = (fdb_encryption_key *)0x117cfd;
    iVar4 = bcmp(pfVar22,pfVar12,pfStack_2af8->metalen);
    if (iVar4 != 0) goto LAB_00117e3d;
    pfVar12 = (fdb_kvs_handle *)pfVar11->body;
    pfStack_2b08 = (fdb_encryption_key *)0x117d18;
    iVar4 = bcmp(&fStack_2a50,pfVar12,pfVar11->bodylen);
    if (iVar4 != 0) goto LAB_00117e2d;
    pfStack_2b08 = (fdb_encryption_key *)0x117d28;
    fdb_doc_free(pfVar11);
    pfStack_2af8 = (fdb_doc *)0x0;
    uVar26 = (uint)uVar28 + 1;
    uVar28 = (ulong)uVar26;
    if (uVar26 == 10) {
      pfStack_2b08 = (fdb_encryption_key *)0x117d4d;
      fdb_close(pfStack_2ae0);
      pfStack_2b08 = (fdb_encryption_key *)0x117d57;
      fdb_close(pfStack_2ad8);
      lVar25 = 0;
      do {
        pfStack_2b08 = (fdb_encryption_key *)0x117d63;
        fdb_doc_free(apfStack_2ad0[lVar25]);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 10);
      pfStack_2b08 = (fdb_encryption_key *)0x117d71;
      fdb_shutdown();
      pfStack_2b08 = (fdb_encryption_key *)0x117d76;
      memleak_end();
      pcVar24 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar24 = "%s FAILED\n";
      }
      pfStack_2b08 = (fdb_encryption_key *)0x117da7;
      fprintf(_stderr,pcVar24,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00117e13:
  pfStack_2b08 = (fdb_encryption_key *)0x117e18;
  flush_before_commit_multi_writers_test();
LAB_00117e18:
  pfStack_2b08 = (fdb_encryption_key *)0x117e1d;
  flush_before_commit_multi_writers_test();
  pfVar11 = pfVar20;
LAB_00117e1d:
  pfStack_2b08 = (fdb_encryption_key *)0x117e2d;
  flush_before_commit_multi_writers_test();
LAB_00117e2d:
  pfStack_2b08 = (fdb_encryption_key *)0x117e3d;
  flush_before_commit_multi_writers_test();
LAB_00117e3d:
  pfVar14 = &fStack_2a50;
  ppfVar13 = &fStack_2a50.bub_ctx.handle;
  pfVar22 = &fStack_2a50.config.encryption_key;
  pfStack_2b08 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_2e80 = (fdb_encryption_key *)0x117e6a;
  uStack_2b30 = uVar28;
  ppfStack_2b28 = ppfVar13;
  pfStack_2b20 = pfVar12;
  pfStack_2b18 = pfVar11;
  pfStack_2b10 = pfVar14;
  pfStack_2b08 = pfVar22;
  gettimeofday((timeval *)(auStack_2e58 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_2e80 = (fdb_encryption_key *)0x117e6f;
  memleak_start();
  pfStack_2e80 = (fdb_encryption_key *)0x117e7b;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar18 = &fStack_2c28;
  pfStack_2e80 = (fdb_encryption_key *)0x117e8b;
  fdb_get_default_config();
  pfStack_2e80 = (fdb_encryption_key *)0x117e95;
  fdb_get_default_kvs_config();
  fStack_2c28.buffercache_size = 0;
  fStack_2c28.wal_threshold = 0x1000;
  fStack_2c28.flags = 1;
  fStack_2c28.durability_opt = '\x02';
  fStack_2c28.auto_commit = true;
  pfStack_2e80 = (fdb_encryption_key *)0x117ec8;
  fVar3 = fdb_open(&pfStack_2e68,"dummy1",pfVar18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_2e80 = (fdb_encryption_key *)0x117ee4;
    fVar3 = fdb_kvs_open_default(pfStack_2e68,&pfStack_2e70,(fdb_kvs_config *)(auStack_2e58 + 8));
    pcVar24 = (char *)pfVar14;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118182;
    pcVar24 = "body%d";
    pfVar22 = (fdb_encryption_key *)0x0;
    do {
      pfStack_2e80 = (fdb_encryption_key *)0x117f15;
      sprintf((char *)afStack_2d28,"key%d",pfVar22);
      pfStack_2e80 = (fdb_encryption_key *)0x117f24;
      sprintf((char *)apfStack_2e28,"body%d",pfVar22);
      pfVar12 = pfStack_2e70;
      pfStack_2e80 = (fdb_encryption_key *)0x117f31;
      sVar15 = strlen((char *)afStack_2d28);
      pfVar18 = (fdb_config *)(sVar15 + 1);
      pfStack_2e80 = (fdb_encryption_key *)0x117f3d;
      sVar15 = strlen((char *)apfStack_2e28);
      pfStack_2e80 = (fdb_encryption_key *)0x117f52;
      fVar3 = fdb_set_kv(pfVar12,afStack_2d28,(size_t)pfVar18,apfStack_2e28,sVar15 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_2e80 = (fdb_encryption_key *)0x118159;
        auto_commit_test();
        goto LAB_00118159;
      }
      uVar26 = (int)pfVar22 + 1;
      pfVar22 = (fdb_encryption_key *)(ulong)uVar26;
    } while (uVar26 != 5000);
    pfVar11 = afStack_2d28;
    ppfVar13 = apfStack_2e28;
    pfVar12 = (fdb_kvs_handle *)auStack_2e58;
    pfVar22 = (fdb_encryption_key *)auStack_2e60;
    pfVar18 = (fdb_config *)0x0;
    do {
      pfStack_2e80 = (fdb_encryption_key *)0x117f90;
      sprintf((char *)pfVar11,"key%d",pfVar18);
      pfStack_2e80 = (fdb_encryption_key *)0x117fa3;
      sprintf((char *)ppfVar13,"body%d",pfVar18);
      pfVar14 = pfStack_2e70;
      pfStack_2e80 = (fdb_encryption_key *)0x117fb0;
      sVar15 = strlen((char *)pfVar11);
      pfStack_2e80 = (fdb_encryption_key *)0x117fc5;
      fVar3 = fdb_get_kv(pfVar14,pfVar11,sVar15 + 1,(void **)pfVar12,(size_t *)pfVar22);
      pcVar24 = (char *)auStack_2e58._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118166;
      pfStack_2e80 = (fdb_encryption_key *)0x117fe2;
      iVar4 = bcmp((void *)auStack_2e58._0_8_,ppfVar13,(size_t)auStack_2e60);
      if (iVar4 != 0) goto LAB_00118159;
      pfStack_2e80 = (fdb_encryption_key *)0x117ff2;
      fdb_free_block(pcVar24);
      uVar26 = (int)pfVar18 + 1;
      pfVar18 = (fdb_config *)(ulong)uVar26;
    } while (uVar26 != 5000);
    pfStack_2e80 = (fdb_encryption_key *)0x118006;
    fVar3 = fdb_kvs_close(pfStack_2e70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118187;
    pfStack_2e80 = (fdb_encryption_key *)0x118018;
    fVar3 = fdb_close(pfStack_2e68);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011818c;
    pfStack_2e80 = (fdb_encryption_key *)0x118039;
    fVar3 = fdb_open(&pfStack_2e68,"dummy1",&fStack_2c28);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118191;
    pfStack_2e80 = (fdb_encryption_key *)0x118055;
    fVar3 = fdb_kvs_open_default(pfStack_2e68,&pfStack_2e70,(fdb_kvs_config *)(auStack_2e58 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118196;
    pfVar11 = afStack_2d28;
    ppfVar13 = apfStack_2e28;
    pfVar12 = (fdb_kvs_handle *)auStack_2e58;
    pfVar22 = (fdb_encryption_key *)auStack_2e60;
    pfVar18 = (fdb_config *)0x0;
    do {
      pfStack_2e80 = (fdb_encryption_key *)0x118089;
      sprintf((char *)pfVar11,"key%d",pfVar18);
      pfStack_2e80 = (fdb_encryption_key *)0x11809c;
      sprintf((char *)ppfVar13,"body%d",pfVar18);
      pfVar14 = pfStack_2e70;
      pfStack_2e80 = (fdb_encryption_key *)0x1180a9;
      sVar15 = strlen((char *)pfVar11);
      pfStack_2e80 = (fdb_encryption_key *)0x1180be;
      fVar3 = fdb_get_kv(pfVar14,pfVar11,sVar15 + 1,(void **)pfVar12,(size_t *)pfVar22);
      pcVar24 = (char *)auStack_2e58._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118178;
      pfStack_2e80 = (fdb_encryption_key *)0x1180db;
      iVar4 = bcmp((void *)auStack_2e58._0_8_,ppfVar13,(size_t)auStack_2e60);
      if (iVar4 != 0) goto LAB_0011816b;
      pfStack_2e80 = (fdb_encryption_key *)0x1180eb;
      fdb_free_block(pcVar24);
      uVar26 = (int)pfVar18 + 1;
      pfVar18 = (fdb_config *)(ulong)uVar26;
    } while (uVar26 != 5000);
    pfStack_2e80 = (fdb_encryption_key *)0x1180ff;
    fVar3 = fdb_close(pfStack_2e68);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_2e80 = (fdb_encryption_key *)0x11810c;
      fdb_shutdown();
      pfStack_2e80 = (fdb_encryption_key *)0x118111;
      memleak_end();
      pcVar24 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar24 = "%s FAILED\n";
      }
      pfStack_2e80 = (fdb_encryption_key *)0x118142;
      fprintf(_stderr,pcVar24,"auto commit test");
      return;
    }
  }
  else {
LAB_0011817d:
    pfStack_2e80 = (fdb_encryption_key *)0x118182;
    auto_commit_test();
    pcVar24 = (char *)pfVar14;
LAB_00118182:
    pfStack_2e80 = (fdb_encryption_key *)0x118187;
    auto_commit_test();
LAB_00118187:
    pfStack_2e80 = (fdb_encryption_key *)0x11818c;
    auto_commit_test();
LAB_0011818c:
    pfStack_2e80 = (fdb_encryption_key *)0x118191;
    auto_commit_test();
LAB_00118191:
    pfStack_2e80 = (fdb_encryption_key *)0x118196;
    auto_commit_test();
LAB_00118196:
    pfStack_2e80 = (fdb_encryption_key *)0x11819b;
    auto_commit_test();
  }
  pfStack_2e80 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_30f8 = (code *)0x1181bd;
  pfStack_2ea8 = pfVar18;
  ppfStack_2ea0 = ppfVar13;
  pfStack_2e98 = pfVar12;
  pfStack_2e90 = pfVar11;
  pfStack_2e88 = (fdb_kvs_handle *)pcVar24;
  pfStack_2e80 = pfVar22;
  gettimeofday(&tStack_30a8,(__timezone_ptr_t)0x0);
  pcStack_30f8 = (code *)0x1181c2;
  memleak_start();
  pcStack_30f8 = (code *)0x1181ce;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_30f8 = (code *)0x1181de;
  fdb_get_default_config();
  fStack_2fa0.buffercache_size = 0;
  fStack_2fa0.auto_commit = true;
  pcStack_30f8 = (code *)0x1181f7;
  fdb_get_default_config();
  pcStack_30f8 = (code *)0x118207;
  memcpy(&fStack_2fa0,afStack_3098,0xf8);
  pcStack_30f8 = (code *)0x118211;
  fdb_get_default_kvs_config();
  uVar28 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_30e0 + 8,"est1",5);
    builtin_strncpy(acStack_30e0,"./func_t",8);
    pcStack_30f8 = (code *)0x11825c;
    fVar3 = fdb_open(&pfStack_30f0,acStack_30e0,&fStack_2fa0);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_30f8 = (code *)0x118278;
    fVar3 = fdb_kvs_open(pfStack_30f0,&pfStack_30e8,"justonekv",&fStack_30c0);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_30f8 = (code *)0x118331;
      auto_commit_space_used_test();
      break;
    }
    pcStack_30f8 = (code *)0x11828e;
    fVar3 = fdb_get_file_info(pfStack_30f0,afStack_3098);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011833b;
    if (afStack_3098[0].file_size != fStack_2fa0.blocksize * 7) {
      pcStack_30f8 = (code *)0x1182dd;
      auto_commit_space_used_test();
    }
    pcStack_30f8 = (code *)0x1182b9;
    fVar3 = fdb_close(pfStack_30f0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118336;
    uVar26 = (int)uVar28 + 1;
    uVar28 = (ulong)uVar26;
    if (uVar26 == 0) {
      pcStack_30f8 = (code *)0x1182e4;
      fdb_shutdown();
      pcStack_30f8 = (code *)0x1182e9;
      memleak_end();
      pcVar24 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar24 = "%s FAILED\n";
      }
      pcStack_30f8 = (code *)0x11831a;
      fprintf(_stderr,pcVar24,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_30f8 = (code *)0x118336;
  auto_commit_space_used_test();
LAB_00118336:
  pcStack_30f8 = (code *)0x11833b;
  auto_commit_space_used_test();
LAB_0011833b:
  pcStack_30f8 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_3100 = 0x745f636e75662f2e;
  pcStack_3110 = "justonekv";
  ppfStack_3690 = (fdb_kvs_handle **)0x118363;
  ppfStack_3120 = &pfStack_30e8;
  pcStack_3118 = acStack_30e0;
  uStack_3108 = uVar28;
  pcStack_30f8 = (code *)&pfStack_30f0;
  gettimeofday(&tStack_3530,(__timezone_ptr_t)0x0);
  ppfStack_3690 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  pfStack_3678 = (fdb_doc *)0x0;
  ppfStack_3690 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_3690 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_3690 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  fStack_3520.buffercache_size = 0;
  fStack_3520.flags = 1;
  fStack_3520.purging_interval = 0;
  fStack_3520.compaction_threshold = '\0';
  ppfStack_3690 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(auStack_3668 + 0x10),"dummy1",&fStack_3520);
  ppfStack_3690 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)auStack_3668,"dummy1",&fStack_3520);
  ppfStack_3690 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3668._16_8_,&pfStack_3670,&fStack_3640);
  ppfStack_3690 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3668._0_8_,(fdb_kvs_handle **)(auStack_3668 + 8),
             &fStack_3640);
  ppfVar19 = apfStack_3628;
  uVar28 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x118422;
    sprintf(acStack_3428,"key%d",uVar28 & 0xffffffff);
    ppfStack_3690 = (fdb_kvs_handle **)0x11843e;
    sprintf(acStack_3228,"meta%d",uVar28 & 0xffffffff);
    ppfVar8 = apfStack_3328;
    ppfStack_3690 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ppfVar8,"body%d",uVar28 & 0xffffffff);
    ppfStack_3690 = (fdb_kvs_handle **)0x118462;
    ppfVar13 = (fdb_kvs_handle **)strlen(acStack_3428);
    ppfStack_3690 = (fdb_kvs_handle **)0x11846d;
    sVar15 = strlen(acStack_3228);
    ppfStack_3690 = (fdb_kvs_handle **)0x118478;
    sVar5 = strlen((char *)ppfVar8);
    ppfStack_3690 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar19,acStack_3428,(size_t)ppfVar13,acStack_3228,sVar15,ppfVar8,sVar5);
    uVar28 = uVar28 + 1;
    ppfVar19 = ppfVar19 + 1;
  } while (uVar28 != 0x1e);
  lVar25 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(pfStack_3670,apfStack_3628[lVar25]);
    lVar25 = lVar25 + 1;
  } while (lVar25 == 1);
  ppfStack_3690 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)auStack_3668._0_8_,'\x02');
  lVar25 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)auStack_3668._8_8_,apfStack_3628[lVar25 + 2]);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 2);
  ppfStack_3690 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)auStack_3668._16_8_,'\x01');
  ppfStack_3690 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)auStack_3668._16_8_);
  ppfStack_3690 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)auStack_3668._0_8_);
  ppfVar29 = (fdb_kvs_handle **)0x1551a5;
  pfVar18 = &fStack_3520;
  ppfStack_3690 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(auStack_3668 + 0x10),"dummy1",pfVar18);
  ppfStack_3690 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)auStack_3668,"dummy1",pfVar18);
  ppfStack_3690 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3668._16_8_,&pfStack_3670,&fStack_3640);
  ppfStack_3690 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3668._0_8_,(fdb_kvs_handle **)(auStack_3668 + 8),
             &fStack_3640);
  uVar28 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&pfStack_3678,apfStack_3628[uVar28]->key,apfStack_3628[uVar28]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3690 = (fdb_kvs_handle **)0x11859e;
    fVar3 = fdb_get(pfStack_3670,pfStack_3678);
    if (uVar28 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_3690 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(pfStack_3678);
    pfStack_3678 = (fdb_doc *)0x0;
    uVar28 = uVar28 + 1;
  } while (uVar28 != 4);
  ppfStack_3690 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)auStack_3668._0_8_,'\x02');
  lVar25 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)auStack_3668._8_8_,apfStack_3628[lVar25 + 2]);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 2);
  lVar25 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x11860e;
    fdb_set(pfStack_3670,apfStack_3628[lVar25 + 4]);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 2);
  ppfStack_3690 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)auStack_3668._0_8_,'\x01');
  ppfStack_3690 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)auStack_3668._16_8_);
  ppfStack_3690 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)auStack_3668._0_8_);
  ppfVar29 = (fdb_kvs_handle **)0x1551a5;
  pfVar18 = &fStack_3520;
  ppfStack_3690 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(auStack_3668 + 0x10),"dummy1",pfVar18);
  ppfStack_3690 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)auStack_3668,"dummy1",pfVar18);
  ppfStack_3690 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3668._16_8_,&pfStack_3670,&fStack_3640);
  ppfStack_3690 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3668._0_8_,(fdb_kvs_handle **)(auStack_3668 + 8),
             &fStack_3640);
  uVar28 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&pfStack_3678,apfStack_3628[uVar28]->key,apfStack_3628[uVar28]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3690 = (fdb_kvs_handle **)0x1186c9;
    fVar3 = fdb_get(pfStack_3670,pfStack_3678);
    if ((uVar28 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_3690 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_3690 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(pfStack_3678);
    pfStack_3678 = (fdb_doc *)0x0;
    uVar28 = uVar28 + 1;
  } while (uVar28 != 6);
  lVar25 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x118707;
    fdb_set(pfStack_3670,apfStack_3628[lVar25 + 4]);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 2);
  ppfStack_3690 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)auStack_3668._0_8_,'\x02');
  lVar25 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)auStack_3668._8_8_,apfStack_3628[lVar25 + 6]);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 2);
  ppfStack_3690 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)auStack_3668._16_8_,'\x01');
  ppfStack_3690 = (fdb_kvs_handle **)0x118767;
  fdb_open(&pfStack_3650,"dummy1",&fStack_3520);
  ppfStack_3690 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(pfStack_3650,&pfStack_3648,&fStack_3640);
  ppfStack_3690 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(pfStack_3650,'\x02');
  lVar25 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x11879a;
    fdb_set(pfStack_3648,apfStack_3628[lVar25 + 8]);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 2);
  ppfStack_3690 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(pfStack_3650,'\x01');
  ppfStack_3690 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)auStack_3668._16_8_);
  ppfStack_3690 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)auStack_3668._0_8_);
  ppfStack_3690 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(pfStack_3650);
  ppfStack_3690 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(auStack_3668 + 0x10),"dummy1",&fStack_3520);
  ppfStack_3690 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3668._16_8_,&pfStack_3670,&fStack_3640);
  uVar28 = 0;
  do {
    ppfStack_3690 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&pfStack_3678,apfStack_3628[uVar28]->key,apfStack_3628[uVar28]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3690 = (fdb_kvs_handle **)0x118837;
    fVar3 = fdb_get(pfStack_3670,pfStack_3678);
    if ((int)uVar28 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_3690 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(pfStack_3678);
    pfStack_3678 = (fdb_doc *)0x0;
    uVar28 = uVar28 + 1;
  } while (uVar28 != 10);
  pfVar18 = (fdb_config *)auStack_3668;
  ppfStack_3690 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar18,"dummy1",&fStack_3520);
  ppfVar8 = &pfStack_3650;
  ppfStack_3690 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ppfVar8,"dummy1",&fStack_3520);
  ppfVar29 = (fdb_kvs_handle **)(auStack_3668 + 8);
  ppfStack_3690 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3668._0_8_,ppfVar29,&fStack_3640);
  ppfStack_3690 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(pfStack_3650,&pfStack_3648,&fStack_3640);
  ppfStack_3690 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)auStack_3668._0_8_,'\x02');
  ppfVar13 = &pfStack_3670;
  ppfStack_3690 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(pfStack_3670,apfStack_3628[10]);
  ppfStack_3690 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)auStack_3668._16_8_,'\x01');
  ppfStack_3690 = (fdb_kvs_handle **)0x118916;
  fdb_set(pfStack_3670,apfStack_3628[0xb]);
  ppfStack_3690 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)auStack_3668._8_8_,apfStack_3628[0xc]);
  ppfStack_3690 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)auStack_3668._16_8_,'\x01');
  ppfStack_3690 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)auStack_3668._8_8_,apfStack_3628[0xd]);
  ppfStack_3690 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(pfStack_3650,'\x02');
  ppfStack_3690 = (fdb_kvs_handle **)0x118961;
  fdb_set(pfStack_3648,apfStack_3628[0xe]);
  ppfStack_3690 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)auStack_3668._0_8_,'\x01');
  ppfStack_3690 = (fdb_kvs_handle **)0x11897f;
  fdb_set(pfStack_3648,apfStack_3628[0xf]);
  ppfStack_3690 = (fdb_kvs_handle **)0x118990;
  fdb_set(pfStack_3670,apfStack_3628[0x10]);
  ppfStack_3690 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(pfStack_3650,'\x01');
  ppfStack_3690 = (fdb_kvs_handle **)0x1189af;
  fdb_set(pfStack_3670,apfStack_3628[0x11]);
  uVar28 = 0;
  ppfStack_3690 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)auStack_3668._16_8_,'\0');
  ppfStack_3690 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)auStack_3668._16_8_);
  ppfStack_3690 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)auStack_3668._0_8_);
  ppfStack_3690 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(pfStack_3650);
  ppfStack_3690 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(auStack_3668 + 0x10),"dummy1",&fStack_3520);
  ppfStack_3690 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)auStack_3668._16_8_,ppfVar13,&fStack_3640);
  while( true ) {
    ppfStack_3690 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&pfStack_3678,apfStack_3628[uVar28 + 10]->key,apfStack_3628[uVar28 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3690 = (fdb_kvs_handle **)0x118a38;
    fVar3 = fdb_get(pfStack_3670,pfStack_3678);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_3690 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(pfStack_3678);
    pfStack_3678 = (fdb_doc *)0x0;
    uVar28 = uVar28 + 1;
    if (uVar28 == 8) {
      ppfStack_3690 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)auStack_3668,"dummy1",&fStack_3520);
      ppfStack_3690 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_3668._0_8_,(fdb_kvs_handle **)(auStack_3668 + 8),
                 &fStack_3640);
      ppfStack_3690 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)auStack_3668._0_8_,'\x02');
      ppfStack_3690 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)auStack_3668._8_8_,apfStack_3628[0x14]);
      ppfStack_3690 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)auStack_3668._16_8_,"dummy2");
      ppfStack_3690 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)auStack_3668._0_8_,'\x01');
      ppfStack_3690 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)auStack_3668._16_8_);
      ppfStack_3690 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)auStack_3668._0_8_);
      lVar25 = 0;
      do {
        ppfStack_3690 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(apfStack_3628[lVar25]);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x1e);
      ppfStack_3690 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_3690 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar24 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar24 = "%s FAILED\n";
      }
      ppfStack_3690 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar24,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_3690 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_3690 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_3690 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_3690 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_3690 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_198d8 = (fdb_doc *)0x118b77;
  ppfStack_36b8 = &pfStack_3678;
  pfStack_36b0 = pfVar18;
  ppfStack_36a8 = ppfVar8;
  uStack_36a0 = uVar28;
  ppfStack_3698 = ppfVar29;
  ppfStack_3690 = ppfVar13;
  gettimeofday(&tStack_19870,(__timezone_ptr_t)0x0);
  pfStack_198d8 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_198c0 = (fdb_doc *)0x0;
  pfStack_198d8 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_198d8 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_198d8 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_195f8.flags = 1;
  fStack_195f8.purging_interval = 0;
  fStack_195f8.compaction_threshold = '\0';
  fStack_195f8.durability_opt = '\x02';
  pfStack_198d8 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_198b8,"dummy1",&fStack_195f8);
  pfStack_198d8 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_198b8,&pfStack_198a8,&fStack_19860);
  ppfVar19 = apfStack_19400;
  pfVar11 = afStack_19800;
  pfVar20 = (fdb_doc *)0x0;
  lVar25 = 0;
  do {
    sVar15 = 0xff7f;
    if (lVar25 == 1) {
      sVar15 = 0x1fff;
    }
    if (lVar25 == 0) {
      sVar15 = 0x7fff;
    }
    pfStack_198d8 = (fdb_doc *)0x118c39;
    lStack_198a0 = lVar25;
    memset(asStack_13640,0x5f,sVar15);
    *(undefined1 *)((long)asStack_13640 + sVar15) = 0;
    lVar25 = 0;
    doc_01 = ppfVar19;
    lStack_19898 = (long)pfVar20;
    ppfStack_19890 = ppfVar19;
    sStack_19878 = sVar15;
    do {
      pfStack_198d8 = (fdb_doc *)0x118c6f;
      lStack_19888 = lVar25;
      sprintf((char *)pfVar11,"%08d");
      asStack_13640[0] = afStack_19800[0].keylen;
      uVar28 = 0;
      lStack_198b0 = (long)pfVar20;
      ppfStack_19880 = doc_01;
      do {
        pfStack_198d8 = (fdb_doc *)0x118cab;
        sprintf((char *)pfVar11,"%08d",uVar28 & 0xffffffff);
        *(size_t *)((long)apfStack_19400 + sStack_19878 + 0x5db8) = afStack_19800[0].keylen;
        uVar26 = (int)lStack_198b0 + (int)uVar28;
        pfStack_198d8 = (fdb_doc *)0x118ce4;
        sprintf(acStack_19500,"meta%d",(ulong)uVar26);
        pfStack_198d8 = (fdb_doc *)0x118cf7;
        sprintf(acStack_19700,"body%d",(ulong)uVar26);
        pfStack_198d8 = (fdb_doc *)0x118d04;
        sVar15 = strlen((char *)asStack_13640);
        pfStack_198d8 = (fdb_doc *)0x118d10;
        sVar5 = strlen(acStack_19500);
        pfStack_198d8 = (fdb_doc *)0x118d24;
        sVar10 = strlen(acStack_19700);
        lVar1 = lStack_198b0;
        pcVar24 = acStack_19700;
        pfStack_198d8 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_01,asStack_13640,sVar15 + 1,acStack_19500,sVar5 + 1,pcVar24,sVar10 + 1);
        uVar28 = uVar28 + 1;
        doc_01 = doc_01 + 1;
      } while (uVar28 != 10);
      lVar25 = lStack_19888 + 1;
      doc_01 = ppfStack_19880 + 10;
      pfVar20 = (fdb_doc *)(lVar1 + 10);
    } while (lVar25 != 100);
    lVar25 = lStack_198a0 + 1;
    ppfVar19 = ppfStack_19890 + 1000;
    pfVar20 = (fdb_doc *)(lStack_19898 + 1000);
  } while (lVar25 != 3);
  lVar25 = 0;
  do {
    pfStack_198d8 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_198a8,apfStack_19400[lVar25]);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 3000);
  pfStack_198d8 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_198b8,'\x01');
  pfStack_198d8 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_198b8,&fStack_19848);
  if (fStack_19848.doc_count != 3000) {
    pfStack_198d8 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar25 = 0;
  while( true ) {
    pfStack_198d8 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_198c0,apfStack_19400[lVar25]->key,apfStack_19400[lVar25]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_198d8 = (fdb_doc *)0x118e52;
    fVar3 = fdb_get(pfStack_198a8,pfStack_198c0);
    doc = pfStack_198c0;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_01 = (fdb_doc **)pfStack_198c0->key;
    pfVar11 = apfStack_19400[lVar25];
    pcVar24 = (char *)pfVar11->key;
    pfStack_198d8 = (fdb_doc *)0x118e7d;
    iVar4 = bcmp(doc_01,pcVar24,pfStack_198c0->keylen);
    pfVar20 = doc;
    if (iVar4 != 0) {
      pfStack_198d8 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_01 = (fdb_doc **)doc->meta;
    pcVar24 = (char *)pfVar11->meta;
    pfStack_198d8 = (fdb_doc *)0x118e9c;
    iVar4 = bcmp(doc_01,pcVar24,doc->metalen);
    if (iVar4 != 0) goto LAB_00118f71;
    doc_01 = (fdb_doc **)doc->body;
    pcVar24 = (char *)pfVar11->body;
    pfStack_198d8 = (fdb_doc *)0x118ebb;
    iVar4 = bcmp(doc_01,pcVar24,doc->bodylen);
    if (iVar4 != 0) goto LAB_00118f66;
    pfStack_198d8 = (fdb_doc *)0x118ecb;
    fdb_doc_free(doc);
    pfStack_198c0 = (fdb_doc *)0x0;
    lVar25 = lVar25 + 1;
    if (lVar25 == 3000) {
      pfStack_198d8 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_198b8);
      lVar25 = 0;
      do {
        pfStack_198d8 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_19400[lVar25]);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 3000);
      pfStack_198d8 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_198d8 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar24 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar24 = "%s FAILED\n";
      }
      pfStack_198d8 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar24,"long key test");
      return;
    }
  }
  pfStack_198d8 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_198d8 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_198d8 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1ddd0 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_19900 = &pfStack_198c0;
  pcStack_198f8 = pcVar24;
  lStack_198f0 = lVar25;
  pfStack_198e8 = pfVar20;
  ppfStack_198e0 = doc_01;
  pfStack_198d8 = pfVar11;
  gettimeofday((timeval *)(auStack_1dd88 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1ddd0 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1ddd0 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1ddd0 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1ddd0 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1dc00.wal_threshold = 0x400;
  fStack_1dc00.compaction_mode = '\0';
  fStack_1dc00.durability_opt = '\x02';
  pcVar27 = (char *)&fStack_1d908;
  ppfVar29 = apfStack_1db08;
  pcVar24 = "kvs%d";
  uVar28 = 0;
  ppfVar13 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1ddd0 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar29,"dummy%d",(ulong)ppfVar13 & 0xffffffff);
    pcVar21 = (char *)(apfStack_1dd08 + (long)ppfVar13 + -10);
    pfStack_1ddd0 = (fdb_kvs_handle *)0x119022;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,(char *)ppfVar29,&fStack_1dc00);
    pfVar12 = (fdb_kvs_handle *)pcVar27;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar2 = (fdb_kvs_handle **)0x0;
    ppfStack_1ddb0 = ppfVar13;
    pfStack_1dda8 = (fdb_kvs_handle *)pcVar27;
    do {
      ppfVar13 = ppfVar2;
      pfStack_1ddd0 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar29,"kvs%d",(ulong)(uint)((int)ppfVar13 + (int)uVar28));
      pfStack_1ddd0 = (fdb_kvs_handle *)0x11905b;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)pcVar21,(fdb_kvs_handle **)pcVar27
                           ,(char *)ppfVar29,&fStack_1dda0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1ddd0 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      pcVar27 = (char *)&(((fdb_kvs_handle *)pcVar27)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_kvs_handle **)((long)ppfVar13 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar13 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar13 = (fdb_kvs_handle **)((long)ppfStack_1ddb0 + 1);
    uVar28 = uVar28 + 0x80;
    pcVar27 = (char *)&pfStack_1dda8[1].bub_ctx.space_used;
  } while (ppfVar13 != (fdb_kvs_handle **)0x8);
  ppfVar13 = apfStack_1dd08;
  ppfVar29 = apfStack_1da08;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    uVar28 = 0;
    do {
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar13,"key%08d",uVar28);
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar29,"value%08d",uVar28);
      pcVar24 = *(char **)(&fStack_1d908.kvs_config.create_if_missing + (long)pfVar12 * 8);
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1190e0;
      sVar15 = strlen((char *)ppfVar13);
      pcVar21 = (char *)(sVar15 + 1);
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1190ec;
      sVar15 = strlen((char *)ppfVar29);
      pfStack_1ddd0 = (fdb_kvs_handle *)0x119101;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar24,ppfVar13,(size_t)pcVar21,ppfVar29,sVar15 + 1);
      pcVar27 = (char *)pfVar12;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar26 = (int)uVar28 + 1;
      uVar28 = (ulong)uVar26;
    } while (uVar26 != 10);
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
  } while (pfVar12 != (fdb_kvs_handle *)0x400);
  pcVar21 = (char *)0x0;
  do {
    if (((ulong)pcVar21 & 1) == 0) {
      pfStack_1ddd0 = (fdb_kvs_handle *)0x11912f;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1dd08[(long)pcVar21 + -10],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1ddd0 = (fdb_kvs_handle *)0x119142;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1dd08[(long)pcVar21 + -10],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    pcVar21 = (char *)((long)pcVar21 + 1);
  } while ((fdb_kvs_handle **)pcVar21 != (fdb_kvs_handle **)0x8);
  ppfVar29 = (fdb_kvs_handle **)0xffffffffffffff80;
  pcVar21 = (char *)apfStack_1b908;
  ppfVar13 = (fdb_kvs_handle **)(auStack_1dd88 + 8);
  pfVar12 = (fdb_kvs_handle *)auStack_1dd88;
  do {
    pfStack_1ddd0 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1d508[(long)ppfVar29],(fdb_kvs_info *)pfVar12);
    if ((fdb_custom_cmp_variable)auStack_1dd88._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1ddd0 = (fdb_kvs_handle *)0x119199;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1d508[(long)ppfVar29],
                              (fdb_kvs_handle **)pcVar21,auStack_1dd88._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar29 = ppfVar29 + 0x10;
    pcVar21 = (char *)((long)pcVar21 + 0x400);
  } while (ppfVar29 < (fdb_kvs_handle **)0x380);
  pcVar21 = (char *)0x0;
  do {
    pfStack_1ddd0 = (fdb_kvs_handle *)0x1191cf;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1dd08[(long)pcVar21 - 10],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    pcVar21 = (char *)((long)pcVar21 + 1);
  } while ((fdb_kvs_handle **)pcVar21 != (fdb_kvs_handle **)0x8);
  pcVar21 = (char *)&pfStack_1ddb8;
  pfStack_1ddb8 = (fdb_kvs_handle *)0x0;
  ppfVar13 = &pfStack_1ddc0;
  pcVar27 = "key%08d";
  ppfVar29 = apfStack_1dd08;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1ddd0 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_1b908[(long)pfVar12],(fdb_iterator **)ppfVar13,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar28 = 0;
    do {
      pfStack_1ddd0 = (fdb_kvs_handle *)0x119233;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1ddc0,(fdb_doc **)pcVar21);
      pcVar24 = (char *)pfVar12;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1ddd0 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar29,"key%08d",uVar28);
      pfStack_1ddd0 = (fdb_kvs_handle *)0x11925b;
      iVar4 = strcmp((char *)ppfVar29,(char *)pfStack_1ddb8->op_stats);
      if (iVar4 != 0) {
        pfStack_1ddd0 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar28 = (ulong)((int)uVar28 + 1);
      pfStack_1ddd0 = (fdb_kvs_handle *)0x11926b;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1ddc0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1ddd0 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1ddc0);
    pcVar24 = (char *)&(pfVar12->config).wal_threshold;
    bVar30 = pfVar12 < (fdb_kvs_handle *)0x380;
    pfVar12 = (fdb_kvs_handle *)pcVar24;
  } while (bVar30);
  pfStack_1ddd0 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1ddb8);
  pcVar21 = "key%08d";
  ppfVar13 = apfStack_1dd08;
  ppfVar29 = (fdb_kvs_handle **)0x0;
  do {
    uVar28 = 0;
    do {
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar13,"key%08d",uVar28);
      pcVar27 = *(char **)(&fStack_1d908.kvs_config.create_if_missing + (long)ppfVar29 * 8);
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1192dd;
      sVar15 = strlen((char *)ppfVar13);
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1192ec;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)pcVar27,ppfVar13,sVar15 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar26 = (int)uVar28 + 1;
      uVar28 = (ulong)uVar26;
    } while (uVar26 != 10);
    ppfVar29 = (fdb_kvs_handle **)((long)ppfVar29 + 1);
  } while (ppfVar29 != (fdb_kvs_handle **)0x400);
  pcVar21 = "dummy_compact%d";
  ppfVar13 = apfStack_1db08;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1ddd0 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar13,"dummy_compact%d",(ulong)pfVar12 & 0xffffffff);
    pfStack_1ddd0 = (fdb_kvs_handle *)0x119336;
    fVar3 = fdb_compact((fdb_file_handle *)
                        apfStack_1dd08[(long)((long)&pfVar12[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar13);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
  } while (pfVar12 != (fdb_kvs_handle *)0x8);
  pcVar21 = (char *)&pfStack_1ddb8;
  pfStack_1ddb8 = (fdb_kvs_handle *)0x0;
  ppfVar13 = &pfStack_1ddc0;
  pcVar27 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1ddd0 = (fdb_kvs_handle *)0x11937c;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1d908.kvs_config.create_if_missing + (long)pcVar27 * 8),
                              (fdb_iterator **)ppfVar13,(void *)0x0,0,(void *)0x0,0,2);
    pfVar12 = (fdb_kvs_handle *)pcVar27;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1ddd0 = (fdb_kvs_handle *)0x119391;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1ddc0,(fdb_doc **)pcVar21);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1193a3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1ddc0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1ddd0 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1ddc0);
    pfVar12 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar27)->config).wal_threshold;
    bVar30 = pcVar27 < (fdb_kvs_handle *)0x380;
    pcVar27 = (char *)pfVar12;
  } while (bVar30);
  pfStack_1ddd0 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1ddb8);
  pcVar21 = (char *)0x0;
  while( true ) {
    pfStack_1ddd0 = (fdb_kvs_handle *)0x1193db;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1dd08[(long)pcVar21 - 10]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcVar21 = (char *)((long)pcVar21 + 1);
    if ((fdb_kvs_handle **)pcVar21 == (fdb_kvs_handle **)0x8) {
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1ddd0 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar24 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar24 = "%s FAILED\n";
      }
      pfStack_1ddd0 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar24,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1ddd0 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1ddd0 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1e148 = (code *)0x119494;
  ppfStack_1dde8 = (fdb_kvs_handle **)pcVar21;
  ppfStack_1dde0 = ppfVar29;
  ppfStack_1ddd8 = ppfVar13;
  pfStack_1ddd0 = pfVar12;
  gettimeofday(&tStack_1e0f8,(__timezone_ptr_t)0x0);
  pcStack_1e148 = (code *)0x119499;
  memleak_start();
  pcStack_1e148 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar18 = &fStack_1e0e8;
  pcStack_1e148 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1e148 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1e148 = (code *)0x1194d0;
  fVar3 = fdb_open(&pfStack_1e128,"./dummy1",pfVar18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1e148 = (code *)0x1194f3;
    fVar3 = fdb_kvs_open(pfStack_1e128,&pfStack_1e120,"db",&fStack_1e110);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1e148 = (code *)0x119516;
    fVar3 = fdb_kvs_open(pfStack_1e128,&pfStack_1e118,"db2",&fStack_1e110);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar18 = &fStack_1def0;
    pcStack_1e148 = (code *)0x119539;
    sprintf((char *)pfVar18,"key%d",0);
    ppfVar13 = apfStack_1dff0;
    pcStack_1e148 = (code *)0x119554;
    sprintf((char *)ppfVar13,"body%d",0);
    pcStack_1e148 = (code *)0x11955c;
    pfVar12 = (fdb_kvs_handle *)strlen((char *)pfVar18);
    pcStack_1e148 = (code *)0x119567;
    sVar15 = strlen((char *)ppfVar13);
    ppfVar29 = &pfStack_1e130;
    pcStack_1e148 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar29,pfVar18,(size_t)pfVar12,(void *)0x0,0,ppfVar13,sVar15 + 1);
    pcStack_1e148 = (code *)0x119597;
    fVar3 = fdb_set(pfStack_1e120,(fdb_doc *)pfStack_1e130);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1e148 = (code *)0x1195ae;
    fVar3 = fdb_commit(pfStack_1e128,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1e148 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1e130->field_6).seqtree,"bOdy%d",0);
    pcStack_1e148 = (code *)0x1195de;
    fVar3 = fdb_set(pfStack_1e118,(fdb_doc *)pfStack_1e130);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1e148 = (code *)0x1195f5;
    fVar3 = fdb_commit(pfStack_1e128,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1e148 = (code *)0x11960c;
    fVar3 = fdb_get_metaonly(pfStack_1e120,(fdb_doc *)pfStack_1e130);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1e148 = (code *)0x119623;
    fVar3 = fdb_get_metaonly(pfStack_1e118,(fdb_doc *)pfStack_1e130);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1e148 = (code *)0x11963a;
    fVar3 = fdb_get_byoffset(pfStack_1e120,(fdb_doc *)pfStack_1e130);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1e148 = (code *)0x11964d;
      fdb_close(pfStack_1e128);
      pcStack_1e148 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1e130);
      pcStack_1e148 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1e148 = (code *)0x119661;
      memleak_end();
      pcVar24 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar24 = "%s FAILED\n";
      }
      pcStack_1e148 = (code *)0x119692;
      fprintf(_stderr,pcVar24,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1e148 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1e148 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1e148 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1e148 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1e148 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1e148 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1e148 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1e148 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1e148 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1e148 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1e170 = pfVar18;
  ppfStack_1e168 = ppfVar29;
  pfStack_1e160 = (fdb_kvs_handle *)pcVar24;
  ppfStack_1e158 = ppfVar13;
  pfStack_1e150 = pfVar12;
  pcStack_1e148 = (code *)uVar28;
  gettimeofday(&tStack_1e580,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1e570.wal_threshold = 0x400;
  fStack_1e570.flags = 1;
  fStack_1e570.purging_interval = 0;
  fStack_1e570.compaction_threshold = '\0';
  fStack_1e570.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1e570.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1e5d8,"./dummy1",&fStack_1e570);
  fdb_kvs_open_default(pfStack_1e5d8,&pfStack_1e5e0,&fStack_1e598);
  fVar3 = fdb_set_log_callback(pfStack_1e5e0,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1e5e0,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar28 = 0;
    do {
      sprintf(acStack_1e378,"key%d",uVar28);
      sprintf(acStack_1e278,"body%d",uVar28);
      pfVar12 = pfStack_1e5e0;
      sVar15 = strlen(acStack_1e378);
      sVar5 = strlen(acStack_1e278);
      fVar3 = fdb_set_kv(pfVar12,acStack_1e378,sVar15,acStack_1e278,sVar5);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar26 = (int)uVar28 + 1;
      uVar28 = (ulong)uVar26;
    } while (uVar26 != 10);
    asStack_1e5c8[1] = 0x726162ffffffff;
    asStack_1e5c8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1e5b0 = 0xbdbdbdbd;
    uStack_1e5ac = 0xbdbdbdbd;
    uStack_1e5a8 = 0xbdbdbdbd;
    uStack_1e5a4 = 0xbdbdbdbd;
    uStack_1e5a0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1e5d8,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1e5e0);
    fdb_close(pfStack_1e5d8);
    fStack_1e570.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1e570.encryption_key.bytes,"bar",4);
    fStack_1e570.encryption_key.bytes[4] = 0xbd;
    fStack_1e570.encryption_key.bytes[5] = 0xbd;
    fStack_1e570.encryption_key.bytes[6] = 0xbd;
    fStack_1e570.encryption_key.bytes[7] = 0xbd;
    fStack_1e570.encryption_key.bytes[8] = 0xbd;
    fStack_1e570.encryption_key.bytes[9] = 0xbd;
    fStack_1e570.encryption_key.bytes[10] = 0xbd;
    fStack_1e570.encryption_key.bytes[0xb] = 0xbd;
    fStack_1e570.encryption_key.bytes[0xc] = 0xbd;
    fStack_1e570.encryption_key.bytes[0xd] = 0xbd;
    fStack_1e570.encryption_key.bytes[0xe] = 0xbd;
    fStack_1e570.encryption_key.bytes[0xf] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x10] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x11] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x12] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x13] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x14] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x15] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x16] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x17] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x18] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x19] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1e570.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1e5d8,"./dummy1",&fStack_1e570);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar3 = fdb_kvs_open_default(pfStack_1e5d8,&pfStack_1e5e0,&fStack_1e598);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1e5e0,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar28 = 0;
      while( true ) {
        sprintf(acStack_1e378,"key%d",uVar28);
        pfVar12 = pfStack_1e5e0;
        sVar15 = strlen(acStack_1e378);
        fVar3 = fdb_get_kv(pfVar12,acStack_1e378,sVar15,&pvStack_1e5d0,asStack_1e5c8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1e478,"body%d",uVar28);
        ptr = pvStack_1e5d0;
        iVar4 = bcmp(pvStack_1e5d0,acStack_1e478,asStack_1e5c8[0]);
        if (iVar4 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar26 = (int)uVar28 + 1;
        uVar28 = (ulong)uVar26;
        if (uVar26 == 10) {
          fdb_kvs_close(pfStack_1e5e0);
          fdb_close(pfStack_1e5d8);
          fdb_shutdown();
          memleak_end();
          pcVar24 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar24 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar24,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
}

Assistant:

void custom_compare_commit_compact(bool eqkeys)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int count;
    int n = 10;
    static const int len = 1024;
    char keybuf[len];
    static const char *achar = "a";
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *iterator;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    uint64_t user_param = 0x1234;
    kvs_config.custom_cmp = _cmp_variable;
    kvs_config.custom_cmp_param = (void*)&user_param;

    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;


    // open db
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);


    for (i=0;i<n;++i){
        if(eqkeys){
            sprintf(keybuf, "%d", i);
            for (j=1;j<len;++j) {
                keybuf[j] = *achar;
            }
        } else {
            sprintf(keybuf, "000%d", i);
            for (j=4;j<len;++j) {
                keybuf[j] = *achar;
            }
        }
        keybuf[len-1] = '\0';
        // set kv
        status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // compact pre & post commit
    fdb_compact(dbfile, NULL);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_compact(dbfile, NULL);

    // scan after flush
    count = 0;
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    if (eqkeys) {
        // since the custom cmp function compares only 3rd~8th bytes,
        // all keys are identified as the same key.
        TEST_CHK(count == 1);
    } else {
        TEST_CHK(count == n);
    }

    fdb_iterator_close(iterator);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("custom compare commit compact");

}